

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O3

bool embree::avx2::CurveNvIntersectorK<8,4>::
     occluded_t<embree::avx2::SweepCurve1IntersectorK<embree::BezierCurveT,4>,embree::avx2::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Primitive PVar7;
  Geometry *pGVar8;
  RTCFilterFunctionN p_Var9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  int iVar18;
  long lVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [12];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 (*pauVar80) [32];
  uint uVar81;
  uint uVar82;
  uint uVar83;
  ulong uVar84;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  ulong uVar85;
  bool bVar86;
  int iVar87;
  ulong uVar88;
  bool bVar89;
  byte bVar90;
  float fVar91;
  undefined8 uVar93;
  undefined1 auVar94 [16];
  undefined4 uVar92;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  float fVar124;
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar95 [16];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar118 [32];
  undefined1 auVar122 [64];
  undefined1 auVar119 [32];
  undefined1 auVar123 [64];
  float fVar125;
  float fVar126;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  float fVar148;
  float fVar149;
  float fVar152;
  float fVar154;
  float fVar156;
  undefined1 auVar141 [32];
  float fVar150;
  float fVar151;
  float fVar153;
  float fVar155;
  float fVar157;
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar133 [16];
  undefined1 auVar146 [64];
  undefined1 auVar147 [64];
  float fVar158;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar164 [16];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar170 [16];
  undefined1 auVar178 [32];
  float fVar179;
  float fVar180;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  float fVar198;
  float fVar199;
  float fVar201;
  float fVar202;
  float fVar203;
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  float fVar200;
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar190 [16];
  undefined1 auVar197 [32];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [28];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [16];
  float fVar243;
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [64];
  float fVar250;
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  float fVar254;
  float fVar255;
  float fVar256;
  float fVar257;
  float fVar258;
  float fVar259;
  undefined1 in_ZMM10 [64];
  undefined1 auVar260 [32];
  float fVar262;
  float fVar263;
  undefined1 auVar261 [64];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 in_ZMM12 [64];
  undefined1 auVar268 [16];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [64];
  undefined1 auVar280 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  int local_bac;
  undefined1 local_b40 [8];
  float fStack_b38;
  float fStack_b34;
  float fStack_b30;
  float fStack_b2c;
  float fStack_b28;
  float fStack_b24;
  uint uStack_ae4;
  float fStack_abc;
  float fStack_ab8;
  float fStack_ab4;
  RTCFilterFunctionNArguments local_9d0;
  undefined1 local_9a0 [8];
  float fStack_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [16];
  undefined1 local_930 [16];
  undefined1 local_920 [8];
  float fStack_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float fStack_908;
  float fStack_904;
  undefined1 local_900 [16];
  undefined1 auStack_8f0 [16];
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  undefined1 auStack_8d0 [16];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [16];
  undefined1 local_890 [16];
  Primitive *local_878;
  Primitive *local_870;
  ulong local_868;
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  undefined1 local_840 [32];
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  undefined1 local_800 [32];
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  undefined1 local_7a0 [16];
  undefined1 auStack_790 [16];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined4 local_6e0;
  undefined4 uStack_6dc;
  undefined4 uStack_6d8;
  undefined4 uStack_6d4;
  uint local_6d0;
  uint uStack_6cc;
  uint uStack_6c8;
  uint uStack_6c4;
  RTCHitN local_6c0 [16];
  undefined1 auStack_6b0 [16];
  undefined4 local_6a0;
  undefined4 uStack_69c;
  undefined4 uStack_698;
  undefined4 uStack_694;
  undefined1 local_690 [16];
  undefined1 local_680 [16];
  undefined8 local_670;
  undefined8 uStack_668;
  undefined1 local_660 [16];
  uint local_650;
  uint uStack_64c;
  uint uStack_648;
  uint uStack_644;
  uint uStack_640;
  uint uStack_63c;
  uint uStack_638;
  uint uStack_634;
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [32];
  uint local_5e0;
  uint uStack_5dc;
  uint uStack_5d8;
  uint uStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  uint uStack_5c4;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [16];
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  float local_480;
  float fStack_47c;
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  float local_460;
  float fStack_45c;
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  float local_440;
  float fStack_43c;
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  float local_3a0;
  float fStack_39c;
  float fStack_398;
  float fStack_394;
  undefined4 uStack_390;
  undefined4 uStack_38c;
  undefined4 uStack_388;
  undefined4 uStack_384;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  float local_340;
  float fStack_33c;
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  undefined8 uStack_140;
  int aiStack_138 [66];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 auVar269 [32];
  undefined1 auVar276 [32];
  
  PVar7 = prim[1];
  uVar88 = (ulong)(byte)PVar7;
  lVar19 = uVar88 * 0x19;
  fVar91 = *(float *)(prim + lVar19 + 0x12);
  auVar10 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar10 = vinsertps_avx(auVar10,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar11 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar11 = vinsertps_avx(auVar11,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar10 = vsubps_avx(auVar10,*(undefined1 (*) [16])(prim + lVar19 + 6));
  auVar94._0_4_ = fVar91 * auVar10._0_4_;
  auVar94._4_4_ = fVar91 * auVar10._4_4_;
  auVar94._8_4_ = fVar91 * auVar10._8_4_;
  auVar94._12_4_ = fVar91 * auVar10._12_4_;
  auVar236._0_4_ = fVar91 * auVar11._0_4_;
  auVar236._4_4_ = fVar91 * auVar11._4_4_;
  auVar236._8_4_ = fVar91 * auVar11._8_4_;
  auVar236._12_4_ = fVar91 * auVar11._12_4_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar88 * 4 + 6);
  auVar104 = vpmovsxbd_avx2(auVar10);
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar88 * 5 + 6);
  auVar224 = vpmovsxbd_avx2(auVar11);
  auVar224 = vcvtdq2ps_avx(auVar224);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = *(ulong *)(prim + uVar88 * 6 + 6);
  auVar107 = vpmovsxbd_avx2(auVar1);
  auVar107 = vcvtdq2ps_avx(auVar107);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *(ulong *)(prim + uVar88 * 0xb + 6);
  auVar253 = vpmovsxbd_avx2(auVar2);
  auVar253 = vcvtdq2ps_avx(auVar253);
  auVar99._8_8_ = 0;
  auVar99._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar7 * 0xc) + 6);
  auVar16 = vpmovsxbd_avx2(auVar99);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + (uint)(byte)PVar7 * 0xc + uVar88 + 6);
  auVar193 = vpmovsxbd_avx2(auVar3);
  auVar193 = vcvtdq2ps_avx(auVar193);
  uVar85 = (ulong)(uint)((int)(uVar88 * 9) * 2);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + uVar85 + 6);
  auVar17 = vpmovsxbd_avx2(auVar4);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar85 + uVar88 + 6);
  auVar173 = vpmovsxbd_avx2(auVar5);
  auVar173 = vcvtdq2ps_avx(auVar173);
  uVar85 = (ulong)(uint)((int)(uVar88 * 5) << 2);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar85 + 6);
  auVar215 = vpmovsxbd_avx2(auVar6);
  auVar215 = vcvtdq2ps_avx(auVar215);
  auVar192._4_4_ = auVar236._0_4_;
  auVar192._0_4_ = auVar236._0_4_;
  auVar192._8_4_ = auVar236._0_4_;
  auVar192._12_4_ = auVar236._0_4_;
  auVar192._16_4_ = auVar236._0_4_;
  auVar192._20_4_ = auVar236._0_4_;
  auVar192._24_4_ = auVar236._0_4_;
  auVar192._28_4_ = auVar236._0_4_;
  auVar10 = vmovshdup_avx(auVar236);
  uVar93 = auVar10._0_8_;
  auVar277._8_8_ = uVar93;
  auVar277._0_8_ = uVar93;
  auVar277._16_8_ = uVar93;
  auVar277._24_8_ = uVar93;
  auVar10 = vshufps_avx(auVar236,auVar236,0xaa);
  fVar91 = auVar10._0_4_;
  auVar249._0_4_ = fVar91 * auVar107._0_4_;
  fVar124 = auVar10._4_4_;
  auVar249._4_4_ = fVar124 * auVar107._4_4_;
  auVar249._8_4_ = fVar91 * auVar107._8_4_;
  auVar249._12_4_ = fVar124 * auVar107._12_4_;
  auVar249._16_4_ = fVar91 * auVar107._16_4_;
  auVar249._20_4_ = fVar124 * auVar107._20_4_;
  auVar249._28_36_ = in_ZMM12._28_36_;
  auVar249._24_4_ = fVar91 * auVar107._24_4_;
  auVar279._0_4_ = auVar193._0_4_ * fVar91;
  auVar279._4_4_ = auVar193._4_4_ * fVar124;
  auVar279._8_4_ = auVar193._8_4_ * fVar91;
  auVar279._12_4_ = auVar193._12_4_ * fVar124;
  auVar279._16_4_ = auVar193._16_4_ * fVar91;
  auVar279._20_4_ = auVar193._20_4_ * fVar124;
  auVar279._28_36_ = in_ZMM10._28_36_;
  auVar279._24_4_ = auVar193._24_4_ * fVar91;
  auVar108._0_4_ = auVar215._0_4_ * fVar91;
  auVar108._4_4_ = auVar215._4_4_ * fVar124;
  auVar108._8_4_ = auVar215._8_4_ * fVar91;
  auVar108._12_4_ = auVar215._12_4_ * fVar124;
  auVar108._16_4_ = auVar215._16_4_ * fVar91;
  auVar108._20_4_ = auVar215._20_4_ * fVar124;
  auVar108._24_4_ = auVar215._24_4_ * fVar91;
  auVar108._28_4_ = 0;
  auVar10 = vfmadd231ps_fma(auVar249._0_32_,auVar277,auVar224);
  auVar11 = vfmadd231ps_fma(auVar279._0_32_,auVar277,auVar16);
  auVar1 = vfmadd231ps_fma(auVar108,auVar173,auVar277);
  auVar2 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar192,auVar104);
  auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar192,auVar253);
  auVar1 = vfmadd231ps_fma(ZEXT1632(auVar1),auVar17,auVar192);
  auVar260._4_4_ = auVar94._0_4_;
  auVar260._0_4_ = auVar94._0_4_;
  auVar260._8_4_ = auVar94._0_4_;
  auVar260._12_4_ = auVar94._0_4_;
  auVar260._16_4_ = auVar94._0_4_;
  auVar260._20_4_ = auVar94._0_4_;
  auVar260._24_4_ = auVar94._0_4_;
  auVar260._28_4_ = auVar94._0_4_;
  auVar10 = vmovshdup_avx(auVar94);
  uVar93 = auVar10._0_8_;
  auVar276._8_8_ = uVar93;
  auVar276._0_8_ = uVar93;
  auVar276._16_8_ = uVar93;
  auVar276._24_8_ = uVar93;
  auVar279 = ZEXT3264(auVar276);
  auVar10 = vshufps_avx(auVar94,auVar94,0xaa);
  fVar91 = auVar10._0_4_;
  auVar237._0_4_ = fVar91 * auVar107._0_4_;
  fVar124 = auVar10._4_4_;
  auVar237._4_4_ = fVar124 * auVar107._4_4_;
  auVar237._8_4_ = fVar91 * auVar107._8_4_;
  auVar237._12_4_ = fVar124 * auVar107._12_4_;
  auVar237._16_4_ = fVar91 * auVar107._16_4_;
  auVar237._20_4_ = fVar124 * auVar107._20_4_;
  auVar237._24_4_ = fVar91 * auVar107._24_4_;
  auVar237._28_4_ = 0;
  auVar14._4_4_ = auVar193._4_4_ * fVar124;
  auVar14._0_4_ = auVar193._0_4_ * fVar91;
  auVar14._8_4_ = auVar193._8_4_ * fVar91;
  auVar14._12_4_ = auVar193._12_4_ * fVar124;
  auVar14._16_4_ = auVar193._16_4_ * fVar91;
  auVar14._20_4_ = auVar193._20_4_ * fVar124;
  auVar14._24_4_ = auVar193._24_4_ * fVar91;
  auVar14._28_4_ = auVar107._28_4_;
  auVar107._4_4_ = auVar215._4_4_ * fVar124;
  auVar107._0_4_ = auVar215._0_4_ * fVar91;
  auVar107._8_4_ = auVar215._8_4_ * fVar91;
  auVar107._12_4_ = auVar215._12_4_ * fVar124;
  auVar107._16_4_ = auVar215._16_4_ * fVar91;
  auVar107._20_4_ = auVar215._20_4_ * fVar124;
  auVar107._24_4_ = auVar215._24_4_ * fVar91;
  auVar107._28_4_ = fVar124;
  auVar10 = vfmadd231ps_fma(auVar237,auVar276,auVar224);
  auVar99 = vfmadd231ps_fma(auVar14,auVar276,auVar16);
  auVar3 = vfmadd231ps_fma(auVar107,auVar276,auVar173);
  auVar4 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar260,auVar104);
  auVar99 = vfmadd231ps_fma(ZEXT1632(auVar99),auVar260,auVar253);
  local_800._8_4_ = 0x7fffffff;
  local_800._0_8_ = 0x7fffffff7fffffff;
  local_800._12_4_ = 0x7fffffff;
  local_800._16_4_ = 0x7fffffff;
  local_800._20_4_ = 0x7fffffff;
  local_800._24_4_ = 0x7fffffff;
  local_800._28_4_ = 0x7fffffff;
  auVar105._8_4_ = 0x219392ef;
  auVar105._0_8_ = 0x219392ef219392ef;
  auVar105._12_4_ = 0x219392ef;
  auVar105._16_4_ = 0x219392ef;
  auVar105._20_4_ = 0x219392ef;
  auVar105._24_4_ = 0x219392ef;
  auVar105._28_4_ = 0x219392ef;
  auVar104 = vandps_avx(ZEXT1632(auVar2),local_800);
  auVar104 = vcmpps_avx(auVar104,auVar105,1);
  auVar224 = vblendvps_avx(ZEXT1632(auVar2),auVar105,auVar104);
  auVar104 = vandps_avx(ZEXT1632(auVar11),local_800);
  auVar104 = vcmpps_avx(auVar104,auVar105,1);
  auVar107 = vblendvps_avx(ZEXT1632(auVar11),auVar105,auVar104);
  auVar104 = vandps_avx(ZEXT1632(auVar1),local_800);
  auVar104 = vcmpps_avx(auVar104,auVar105,1);
  auVar104 = vblendvps_avx(ZEXT1632(auVar1),auVar105,auVar104);
  auVar2 = vfmadd231ps_fma(ZEXT1632(auVar3),auVar260,auVar17);
  auVar253 = vrcpps_avx(auVar224);
  auVar223._8_4_ = 0x3f800000;
  auVar223._0_8_ = 0x3f8000003f800000;
  auVar223._12_4_ = 0x3f800000;
  auVar223._16_4_ = 0x3f800000;
  auVar223._20_4_ = 0x3f800000;
  auVar223._24_4_ = 0x3f800000;
  auVar223._28_4_ = 0x3f800000;
  auVar10 = vfnmadd213ps_fma(auVar224,auVar253,auVar223);
  auVar10 = vfmadd132ps_fma(ZEXT1632(auVar10),auVar253,auVar253);
  auVar224 = vrcpps_avx(auVar107);
  auVar11 = vfnmadd213ps_fma(auVar107,auVar224,auVar223);
  auVar11 = vfmadd132ps_fma(ZEXT1632(auVar11),auVar224,auVar224);
  auVar224 = vrcpps_avx(auVar104);
  auVar1 = vfnmadd213ps_fma(auVar104,auVar224,auVar223);
  auVar1 = vfmadd132ps_fma(ZEXT1632(auVar1),auVar224,auVar224);
  auVar104 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar88 * 7 + 6));
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar104 = vsubps_avx(auVar104,ZEXT1632(auVar4));
  auVar253._4_4_ = auVar10._4_4_ * auVar104._4_4_;
  auVar253._0_4_ = auVar10._0_4_ * auVar104._0_4_;
  auVar253._8_4_ = auVar10._8_4_ * auVar104._8_4_;
  auVar253._12_4_ = auVar10._12_4_ * auVar104._12_4_;
  auVar253._16_4_ = auVar104._16_4_ * 0.0;
  auVar253._20_4_ = auVar104._20_4_ * 0.0;
  auVar253._24_4_ = auVar104._24_4_ * 0.0;
  auVar253._28_4_ = auVar104._28_4_;
  auVar104 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar88 * 9 + 6));
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar104 = vsubps_avx(auVar104,ZEXT1632(auVar4));
  auVar16._4_4_ = auVar10._4_4_ * auVar104._4_4_;
  auVar16._0_4_ = auVar10._0_4_ * auVar104._0_4_;
  auVar16._8_4_ = auVar10._8_4_ * auVar104._8_4_;
  auVar16._12_4_ = auVar10._12_4_ * auVar104._12_4_;
  auVar16._16_4_ = auVar104._16_4_ * 0.0;
  auVar16._20_4_ = auVar104._20_4_ * 0.0;
  auVar16._24_4_ = auVar104._24_4_ * 0.0;
  auVar16._28_4_ = auVar104._28_4_;
  auVar141._1_3_ = 0;
  auVar141[0] = PVar7;
  auVar224 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar7 * 0x10 + 6));
  auVar104 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar7 * 0x10 + uVar88 * -2 + 6));
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar104 = vsubps_avx(auVar104,ZEXT1632(auVar99));
  auVar193._4_4_ = auVar104._4_4_ * auVar11._4_4_;
  auVar193._0_4_ = auVar104._0_4_ * auVar11._0_4_;
  auVar193._8_4_ = auVar104._8_4_ * auVar11._8_4_;
  auVar193._12_4_ = auVar104._12_4_ * auVar11._12_4_;
  auVar193._16_4_ = auVar104._16_4_ * 0.0;
  auVar193._20_4_ = auVar104._20_4_ * 0.0;
  auVar193._24_4_ = auVar104._24_4_ * 0.0;
  auVar193._28_4_ = auVar104._28_4_;
  auVar104 = vcvtdq2ps_avx(auVar224);
  auVar104 = vsubps_avx(auVar104,ZEXT1632(auVar99));
  auVar17._4_4_ = auVar11._4_4_ * auVar104._4_4_;
  auVar17._0_4_ = auVar11._0_4_ * auVar104._0_4_;
  auVar17._8_4_ = auVar11._8_4_ * auVar104._8_4_;
  auVar17._12_4_ = auVar11._12_4_ * auVar104._12_4_;
  auVar17._16_4_ = auVar104._16_4_ * 0.0;
  auVar17._20_4_ = auVar104._20_4_ * 0.0;
  auVar17._24_4_ = auVar104._24_4_ * 0.0;
  auVar17._28_4_ = auVar104._28_4_;
  auVar104 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar85 + uVar88 + 6));
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar104 = vsubps_avx(auVar104,ZEXT1632(auVar2));
  auVar173._4_4_ = auVar104._4_4_ * auVar1._4_4_;
  auVar173._0_4_ = auVar104._0_4_ * auVar1._0_4_;
  auVar173._8_4_ = auVar104._8_4_ * auVar1._8_4_;
  auVar173._12_4_ = auVar104._12_4_ * auVar1._12_4_;
  auVar173._16_4_ = auVar104._16_4_ * 0.0;
  auVar173._20_4_ = auVar104._20_4_ * 0.0;
  auVar173._24_4_ = auVar104._24_4_ * 0.0;
  auVar173._28_4_ = auVar104._28_4_;
  auVar104 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar88 * 0x17 + 6));
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar104 = vsubps_avx(auVar104,ZEXT1632(auVar2));
  auVar215._4_4_ = auVar1._4_4_ * auVar104._4_4_;
  auVar215._0_4_ = auVar1._0_4_ * auVar104._0_4_;
  auVar215._8_4_ = auVar1._8_4_ * auVar104._8_4_;
  auVar215._12_4_ = auVar1._12_4_ * auVar104._12_4_;
  auVar215._16_4_ = auVar104._16_4_ * 0.0;
  auVar215._20_4_ = auVar104._20_4_ * 0.0;
  auVar215._24_4_ = auVar104._24_4_ * 0.0;
  auVar215._28_4_ = auVar104._28_4_;
  auVar104 = vpminsd_avx2(auVar253,auVar16);
  auVar224 = vpminsd_avx2(auVar193,auVar17);
  auVar104 = vmaxps_avx(auVar104,auVar224);
  uVar92 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar238._4_4_ = uVar92;
  auVar238._0_4_ = uVar92;
  auVar238._8_4_ = uVar92;
  auVar238._12_4_ = uVar92;
  auVar238._16_4_ = uVar92;
  auVar238._20_4_ = uVar92;
  auVar238._24_4_ = uVar92;
  auVar238._28_4_ = uVar92;
  auVar224 = vpminsd_avx2(auVar173,auVar215);
  auVar224 = vmaxps_avx(auVar224,auVar238);
  auVar104 = vmaxps_avx(auVar104,auVar224);
  local_360._4_4_ = auVar104._4_4_ * 0.99999964;
  local_360._0_4_ = auVar104._0_4_ * 0.99999964;
  local_360._8_4_ = auVar104._8_4_ * 0.99999964;
  local_360._12_4_ = auVar104._12_4_ * 0.99999964;
  local_360._16_4_ = auVar104._16_4_ * 0.99999964;
  local_360._20_4_ = auVar104._20_4_ * 0.99999964;
  local_360._24_4_ = auVar104._24_4_ * 0.99999964;
  local_360._28_4_ = auVar224._28_4_;
  auVar104 = vpmaxsd_avx2(auVar253,auVar16);
  auVar224 = vpmaxsd_avx2(auVar193,auVar17);
  auVar104 = vminps_avx(auVar104,auVar224);
  auVar224 = vpmaxsd_avx2(auVar173,auVar215);
  uVar92 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar171._4_4_ = uVar92;
  auVar171._0_4_ = uVar92;
  auVar171._8_4_ = uVar92;
  auVar171._12_4_ = uVar92;
  auVar171._16_4_ = uVar92;
  auVar171._20_4_ = uVar92;
  auVar171._24_4_ = uVar92;
  auVar171._28_4_ = uVar92;
  auVar224 = vminps_avx(auVar224,auVar171);
  auVar104 = vminps_avx(auVar104,auVar224);
  auVar15._4_4_ = auVar104._4_4_ * 1.0000004;
  auVar15._0_4_ = auVar104._0_4_ * 1.0000004;
  auVar15._8_4_ = auVar104._8_4_ * 1.0000004;
  auVar15._12_4_ = auVar104._12_4_ * 1.0000004;
  auVar15._16_4_ = auVar104._16_4_ * 1.0000004;
  auVar15._20_4_ = auVar104._20_4_ * 1.0000004;
  auVar15._24_4_ = auVar104._24_4_ * 1.0000004;
  auVar15._28_4_ = auVar104._28_4_;
  auVar141[4] = PVar7;
  auVar141._5_3_ = 0;
  auVar141[8] = PVar7;
  auVar141._9_3_ = 0;
  auVar141[0xc] = PVar7;
  auVar141._13_3_ = 0;
  auVar141[0x10] = PVar7;
  auVar141._17_3_ = 0;
  auVar141[0x14] = PVar7;
  auVar141._21_3_ = 0;
  auVar141[0x18] = PVar7;
  auVar141._25_3_ = 0;
  auVar141[0x1c] = PVar7;
  auVar141._29_3_ = 0;
  auVar224 = vpcmpgtd_avx2(auVar141,_DAT_01fe9900);
  auVar104 = vcmpps_avx(local_360,auVar15,2);
  auVar104 = vandps_avx(auVar104,auVar224);
  uVar83 = vmovmskps_avx(auVar104);
  if (uVar83 == 0) {
    return false;
  }
  uVar83 = uVar83 & 0xff;
  local_878 = prim + lVar19 + 0x16;
  auVar104._16_16_ = mm_lookupmask_ps._240_16_;
  auVar104._0_16_ = mm_lookupmask_ps._240_16_;
  local_600 = vblendps_avx(auVar104,ZEXT832(0) << 0x20,0x80);
  local_5e0 = 0x80000000;
  uStack_5dc = 0x80000000;
  uStack_5d8 = 0x80000000;
  uStack_5d4 = 0x80000000;
  fStack_5d0 = -0.0;
  fStack_5cc = -0.0;
  fStack_5c8 = -0.0;
  uStack_5c4 = 0x80000000;
  local_870 = prim;
LAB_017646db:
  lVar19 = 0;
  local_868 = (ulong)uVar83;
  for (uVar88 = local_868; (uVar88 & 1) == 0; uVar88 = uVar88 >> 1 | 0x8000000000000000) {
    lVar19 = lVar19 + 1;
  }
  local_868 = local_868 - 1 & local_868;
  local_6e0 = *(undefined4 *)(local_870 + lVar19 * 4 + 6);
  uVar88 = (ulong)(uint)((int)lVar19 << 6);
  auVar10 = *(undefined1 (*) [16])(local_878 + uVar88);
  if (local_868 != 0) {
    uVar84 = local_868 - 1 & local_868;
    for (uVar85 = local_868; (uVar85 & 1) == 0; uVar85 = uVar85 >> 1 | 0x8000000000000000) {
    }
    if (uVar84 != 0) {
      for (; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar11 = *(undefined1 (*) [16])(local_878 + uVar88 + 0x10);
  auVar1 = *(undefined1 (*) [16])(local_878 + uVar88 + 0x20);
  auVar2 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x1c
                        );
  auVar3 = vinsertps_avx(auVar2,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  uVar92 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar166._4_4_ = uVar92;
  auVar166._0_4_ = uVar92;
  auVar166._8_4_ = uVar92;
  auVar166._12_4_ = uVar92;
  fStack_7b0 = (float)uVar92;
  _local_7c0 = auVar166;
  fStack_7ac = (float)uVar92;
  fStack_7a8 = (float)uVar92;
  register0x0000159c = uVar92;
  auVar2 = *(undefined1 (*) [16])(local_878 + uVar88 + 0x30);
  uVar92 = *(undefined4 *)(ray + k * 4 + 0x50);
  auVar233._4_4_ = uVar92;
  auVar233._0_4_ = uVar92;
  auVar233._8_4_ = uVar92;
  auVar233._12_4_ = uVar92;
  fStack_990 = (float)uVar92;
  _local_9a0 = auVar233;
  fStack_98c = (float)uVar92;
  fStack_988 = (float)uVar92;
  register0x000014dc = uVar92;
  auVar99 = vunpcklps_avx(auVar166,auVar233);
  fVar91 = *(float *)(ray + k * 4 + 0x60);
  auVar268._4_4_ = fVar91;
  auVar268._0_4_ = fVar91;
  auVar268._8_4_ = fVar91;
  auVar268._12_4_ = fVar91;
  auVar269._16_4_ = fVar91;
  auVar269._0_16_ = auVar268;
  auVar269._20_4_ = fVar91;
  auVar269._24_4_ = fVar91;
  auVar269._28_4_ = fVar91;
  local_930 = vinsertps_avx(auVar99,auVar268,0x28);
  auVar160._0_4_ = (auVar10._0_4_ + auVar11._0_4_ + auVar1._0_4_ + auVar2._0_4_) * 0.25;
  auVar160._4_4_ = (auVar10._4_4_ + auVar11._4_4_ + auVar1._4_4_ + auVar2._4_4_) * 0.25;
  auVar160._8_4_ = (auVar10._8_4_ + auVar11._8_4_ + auVar1._8_4_ + auVar2._8_4_) * 0.25;
  auVar160._12_4_ = (auVar10._12_4_ + auVar11._12_4_ + auVar1._12_4_ + auVar2._12_4_) * 0.25;
  auVar99 = vsubps_avx(auVar160,auVar3);
  auVar99 = vdpps_avx(auVar99,local_930,0x7f);
  local_940 = vdpps_avx(local_930,local_930,0x7f);
  auVar249 = ZEXT1664(local_940);
  uVar83 = *(uint *)(local_870 + 2);
  auVar4 = vrcpss_avx(local_940,local_940);
  auVar5 = vfnmadd213ss_fma(auVar4,local_940,ZEXT416(0x40000000));
  local_340 = auVar99._0_4_ * auVar4._0_4_ * auVar5._0_4_;
  auVar101._4_4_ = local_340;
  auVar101._0_4_ = local_340;
  auVar101._8_4_ = local_340;
  auVar101._12_4_ = local_340;
  fStack_910 = local_340;
  _local_920 = auVar101;
  fStack_90c = local_340;
  fStack_908 = local_340;
  fStack_904 = local_340;
  auVar99 = vfmadd231ps_fma(auVar3,local_930,auVar101);
  auVar99 = vblendps_avx(auVar99,_DAT_01f7aa10,8);
  auVar3 = vsubps_avx(auVar10,auVar99);
  auVar4 = vsubps_avx(auVar1,auVar99);
  auVar5 = vsubps_avx(auVar11,auVar99);
  auVar2 = vsubps_avx(auVar2,auVar99);
  auVar10 = vmovshdup_avx(auVar3);
  local_1e0 = auVar10._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar10 = vshufps_avx(auVar3,auVar3,0xaa);
  local_200 = auVar10._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar10 = vshufps_avx(auVar3,auVar3,0xff);
  uVar93 = auVar10._0_8_;
  auVar224._8_8_ = uVar93;
  auVar224._0_8_ = uVar93;
  auVar224._16_8_ = uVar93;
  auVar224._24_8_ = uVar93;
  auVar10 = vmovshdup_avx(auVar5);
  local_220 = auVar10._0_8_;
  uStack_218 = local_220;
  uStack_210 = local_220;
  uStack_208 = local_220;
  auVar11 = vshufps_avx(auVar5,auVar5,0xaa);
  uVar93 = auVar11._0_8_;
  auVar264._8_8_ = uVar93;
  auVar264._0_8_ = uVar93;
  auVar264._16_8_ = uVar93;
  auVar264._24_8_ = uVar93;
  auVar10 = vshufps_avx(auVar5,auVar5,0xff);
  local_240 = auVar10._0_8_;
  uStack_238 = local_240;
  uStack_230 = local_240;
  uStack_228 = local_240;
  auVar10 = vmovshdup_avx(auVar4);
  local_440 = auVar10._0_4_;
  fStack_43c = auVar10._4_4_;
  auVar10 = vshufps_avx(auVar4,auVar4,0xaa);
  local_460 = auVar10._0_4_;
  fStack_45c = auVar10._4_4_;
  auVar10 = vshufps_avx(auVar4,auVar4,0xff);
  local_480 = auVar10._0_4_;
  fStack_47c = auVar10._4_4_;
  auVar10 = vmovshdup_avx(auVar2);
  local_260 = auVar10._0_8_;
  uStack_258 = local_260;
  uStack_250 = local_260;
  uStack_248 = local_260;
  auVar10 = vshufps_avx(auVar2,auVar2,0xaa);
  local_280 = auVar10._0_8_;
  uStack_278 = local_280;
  uStack_270 = local_280;
  uStack_268 = local_280;
  auVar10 = vshufps_avx(auVar2,auVar2,0xff);
  local_2a0 = auVar10._0_8_;
  uStack_298 = local_2a0;
  uStack_290 = local_2a0;
  uStack_288 = local_2a0;
  auVar10 = vfmadd231ps_fma(ZEXT432((uint)(fVar91 * fVar91)),_local_9a0,_local_9a0);
  auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),_local_7c0,_local_7c0);
  uVar92 = auVar10._0_4_;
  local_2c0._4_4_ = uVar92;
  local_2c0._0_4_ = uVar92;
  local_2c0._8_4_ = uVar92;
  local_2c0._12_4_ = uVar92;
  local_2c0._16_4_ = uVar92;
  local_2c0._20_4_ = uVar92;
  local_2c0._24_4_ = uVar92;
  local_2c0._28_4_ = uVar92;
  auVar261 = ZEXT3264(local_2c0);
  fVar124 = *(float *)(ray + k * 4 + 0x30);
  local_8a0 = ZEXT416((uint)local_340);
  local_340 = fVar124 - local_340;
  fStack_33c = local_340;
  fStack_338 = local_340;
  fStack_334 = local_340;
  fStack_330 = local_340;
  fStack_32c = local_340;
  fStack_328 = local_340;
  fStack_324 = local_340;
  local_bac = 1;
  uVar88 = 0;
  bVar86 = false;
  local_2e0._0_4_ = auVar3._0_4_;
  local_2e0._4_4_ = local_2e0._0_4_;
  local_2e0._8_4_ = local_2e0._0_4_;
  local_2e0._12_4_ = local_2e0._0_4_;
  local_2e0._16_4_ = local_2e0._0_4_;
  local_2e0._20_4_ = local_2e0._0_4_;
  local_2e0._24_4_ = local_2e0._0_4_;
  local_2e0._28_4_ = local_2e0._0_4_;
  fVar125 = auVar5._0_4_;
  auVar251._4_4_ = fVar125;
  auVar251._0_4_ = fVar125;
  auVar251._8_4_ = fVar125;
  auVar251._12_4_ = fVar125;
  auVar251._16_4_ = fVar125;
  auVar251._20_4_ = fVar125;
  auVar251._24_4_ = fVar125;
  auVar251._28_4_ = fVar125;
  fVar158 = auVar4._0_4_;
  local_300._4_4_ = fVar158;
  local_300._0_4_ = fVar158;
  local_300._8_4_ = fVar158;
  local_300._12_4_ = fVar158;
  local_300._16_4_ = fVar158;
  local_300._20_4_ = fVar158;
  local_300._24_4_ = fVar158;
  local_300._28_4_ = fVar158;
  fVar179 = auVar2._0_4_;
  local_4c0 = vandps_avx(local_2c0,local_800);
  auVar10 = vsqrtss_avx(local_940,local_940);
  auVar1 = vsqrtss_avx(local_940,local_940);
  local_4f0 = ZEXT816(0x3f80000000000000);
  local_320 = fVar179;
  fStack_31c = fVar179;
  fStack_318 = fVar179;
  fStack_314 = fVar179;
  fStack_310 = fVar179;
  fStack_30c = fVar179;
  fStack_308 = fVar179;
  fStack_304 = fVar179;
  uStack_6dc = local_6e0;
  uStack_6d8 = local_6e0;
  uStack_6d4 = local_6e0;
  local_6d0 = uVar83;
  uStack_6cc = uVar83;
  uStack_6c8 = uVar83;
  uStack_6c4 = uVar83;
  local_4a0 = auVar224;
  fStack_478 = local_480;
  fStack_474 = fStack_47c;
  fStack_470 = local_480;
  fStack_46c = fStack_47c;
  fStack_468 = local_480;
  fStack_464 = fStack_47c;
  fStack_458 = local_460;
  fStack_454 = fStack_45c;
  fStack_450 = local_460;
  fStack_44c = fStack_45c;
  fStack_448 = local_460;
  fStack_444 = fStack_45c;
  fStack_438 = local_440;
  fStack_434 = fStack_43c;
  fStack_430 = local_440;
  fStack_42c = fStack_43c;
  fStack_428 = local_440;
  fStack_424 = fStack_43c;
  do {
    auVar191._8_4_ = 0x3f800000;
    auVar191._0_8_ = 0x3f8000003f800000;
    auVar191._12_4_ = 0x3f800000;
    auVar191._16_4_ = 0x3f800000;
    auVar191._20_4_ = 0x3f800000;
    iVar87 = (int)uVar88;
    auVar191._24_4_ = 0x3f800000;
    auVar191._28_4_ = 0x3f800000;
    auVar99 = vmovshdup_avx(local_4f0);
    auVar99 = vsubps_avx(auVar99,local_4f0);
    fVar152 = auVar99._0_4_;
    fVar156 = fVar152 * 0.04761905;
    local_720._0_4_ = local_4f0._0_4_;
    local_720._4_4_ = local_720._0_4_;
    local_720._8_4_ = local_720._0_4_;
    local_720._12_4_ = local_720._0_4_;
    local_720._16_4_ = local_720._0_4_;
    local_720._20_4_ = local_720._0_4_;
    local_720._24_4_ = local_720._0_4_;
    local_720._28_4_ = local_720._0_4_;
    local_980._4_4_ = fVar152;
    local_980._0_4_ = fVar152;
    local_980._8_4_ = fVar152;
    local_980._12_4_ = fVar152;
    local_980._16_4_ = fVar152;
    local_980._20_4_ = fVar152;
    local_980._24_4_ = fVar152;
    local_980._28_4_ = fVar152;
    auVar99 = vfmadd231ps_fma(local_720,local_980,_DAT_01faff20);
    auVar104 = vsubps_avx(auVar191,ZEXT1632(auVar99));
    fVar126 = auVar99._0_4_;
    auVar146._0_4_ = fVar125 * fVar126;
    fVar148 = auVar99._4_4_;
    auVar146._4_4_ = fVar125 * fVar148;
    fVar149 = auVar99._8_4_;
    auVar146._8_4_ = fVar125 * fVar149;
    fVar150 = auVar99._12_4_;
    auVar146._12_4_ = fVar125 * fVar150;
    auVar146._16_4_ = fVar125 * 0.0;
    auVar146._20_4_ = fVar125 * 0.0;
    auVar146._28_36_ = auVar261._28_36_;
    auVar146._24_4_ = fVar125 * 0.0;
    auVar75._8_8_ = uStack_218;
    auVar75._0_8_ = local_220;
    auVar75._16_8_ = uStack_210;
    auVar75._24_8_ = uStack_208;
    auVar261._0_4_ = (float)local_220 * fVar126;
    auVar261._4_4_ = (float)((ulong)local_220 >> 0x20) * fVar148;
    auVar261._8_4_ = (float)uStack_218 * fVar149;
    auVar261._12_4_ = (float)((ulong)uStack_218 >> 0x20) * fVar150;
    auVar261._16_4_ = (float)uStack_210 * 0.0;
    auVar261._20_4_ = (float)((ulong)uStack_210 >> 0x20) * 0.0;
    auVar261._28_36_ = auVar249._28_36_;
    auVar261._24_4_ = (float)uStack_208 * 0.0;
    fVar154 = auVar11._0_4_;
    auVar280._0_4_ = fVar154 * fVar126;
    fVar151 = auVar11._4_4_;
    auVar280._4_4_ = fVar151 * fVar148;
    auVar280._8_4_ = fVar154 * fVar149;
    auVar280._12_4_ = fVar151 * fVar150;
    auVar280._16_4_ = fVar154 * 0.0;
    auVar280._20_4_ = fVar151 * 0.0;
    auVar280._28_36_ = auVar279._28_36_;
    auVar280._24_4_ = fVar154 * 0.0;
    auVar74._8_8_ = uStack_238;
    auVar74._0_8_ = local_240;
    auVar74._16_8_ = uStack_230;
    auVar74._24_8_ = uStack_228;
    auVar12._4_4_ = (float)((ulong)local_240 >> 0x20) * fVar148;
    auVar12._0_4_ = (float)local_240 * fVar126;
    auVar12._8_4_ = (float)uStack_238 * fVar149;
    auVar12._12_4_ = (float)((ulong)uStack_238 >> 0x20) * fVar150;
    auVar12._16_4_ = (float)uStack_230 * 0.0;
    auVar12._20_4_ = (float)((ulong)uStack_230 >> 0x20) * 0.0;
    auVar12._24_4_ = (float)uStack_228 * 0.0;
    auVar12._28_4_ = fVar152;
    auVar99 = vfmadd231ps_fma(auVar146._0_32_,auVar104,local_2e0);
    auVar77._8_8_ = uStack_1d8;
    auVar77._0_8_ = local_1e0;
    auVar77._16_8_ = uStack_1d0;
    auVar77._24_8_ = uStack_1c8;
    auVar6 = vfmadd231ps_fma(auVar261._0_32_,auVar104,auVar77);
    auVar76._8_8_ = uStack_1f8;
    auVar76._0_8_ = local_200;
    auVar76._16_8_ = uStack_1f0;
    auVar76._24_8_ = uStack_1e8;
    auVar94 = vfmadd231ps_fma(auVar280._0_32_,auVar104,auVar76);
    auVar236 = vfmadd231ps_fma(auVar12,auVar104,auVar224);
    auVar13._4_4_ = local_300._4_4_ * fVar148;
    auVar13._0_4_ = local_300._0_4_ * fVar126;
    auVar13._8_4_ = local_300._8_4_ * fVar149;
    auVar13._12_4_ = local_300._12_4_ * fVar150;
    auVar13._16_4_ = local_300._16_4_ * 0.0;
    auVar13._20_4_ = local_300._20_4_ * 0.0;
    auVar13._24_4_ = local_300._24_4_ * 0.0;
    auVar13._28_4_ = local_300._28_4_;
    auVar20._4_4_ = fVar148 * fStack_43c;
    auVar20._0_4_ = fVar126 * local_440;
    auVar20._8_4_ = fVar149 * fStack_438;
    auVar20._12_4_ = fVar150 * fStack_434;
    auVar20._16_4_ = fStack_430 * 0.0;
    auVar20._20_4_ = fStack_42c * 0.0;
    auVar20._24_4_ = fStack_428 * 0.0;
    auVar20._28_4_ = auVar224._28_4_;
    auVar78._4_4_ = fVar148 * fStack_45c;
    auVar78._0_4_ = fVar126 * local_460;
    auVar78._8_4_ = fVar149 * fStack_458;
    auVar78._12_4_ = fVar150 * fStack_454;
    auVar78._16_4_ = fStack_450 * 0.0;
    auVar78._20_4_ = fStack_44c * 0.0;
    auVar78._24_4_ = fStack_448 * 0.0;
    auVar78._28_4_ = DAT_01faff20._28_4_;
    auVar21._4_4_ = fVar148 * fStack_47c;
    auVar21._0_4_ = fVar126 * local_480;
    auVar21._8_4_ = fVar149 * fStack_478;
    auVar21._12_4_ = fVar150 * fStack_474;
    auVar21._16_4_ = fStack_470 * 0.0;
    auVar21._20_4_ = fStack_46c * 0.0;
    auVar21._24_4_ = fStack_468 * 0.0;
    auVar21._28_4_ = 0x3f800000;
    auVar160 = vfmadd231ps_fma(auVar13,auVar104,auVar251);
    auVar101 = vfmadd231ps_fma(auVar20,auVar104,auVar75);
    auVar233 = vfmadd231ps_fma(auVar78,auVar104,auVar264);
    auVar268 = vfmadd231ps_fma(auVar21,auVar104,auVar74);
    auVar22._4_4_ = fStack_31c * fVar148;
    auVar22._0_4_ = local_320 * fVar126;
    auVar22._8_4_ = fStack_318 * fVar149;
    auVar22._12_4_ = fStack_314 * fVar150;
    auVar22._16_4_ = fStack_310 * 0.0;
    auVar22._20_4_ = fStack_30c * 0.0;
    auVar22._24_4_ = fStack_308 * 0.0;
    auVar22._28_4_ = fStack_304;
    auVar23._4_4_ = fVar148 * local_260._4_4_;
    auVar23._0_4_ = fVar126 * (float)local_260;
    auVar23._8_4_ = fVar149 * (float)uStack_258;
    auVar23._12_4_ = fVar150 * uStack_258._4_4_;
    auVar23._16_4_ = (float)uStack_250 * 0.0;
    auVar23._20_4_ = uStack_250._4_4_ * 0.0;
    auVar23._24_4_ = (float)uStack_248 * 0.0;
    auVar23._28_4_ = fVar151;
    auVar24._28_4_ = local_2e0._28_4_;
    auVar24._0_28_ =
         ZEXT1628(CONCAT412(auVar160._12_4_ * fVar150,
                            CONCAT48(auVar160._8_4_ * fVar149,
                                     CONCAT44(auVar160._4_4_ * fVar148,auVar160._0_4_ * fVar126))));
    auVar99 = vfmadd231ps_fma(auVar24,auVar104,ZEXT1632(auVar99));
    auVar6 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar150 * auVar101._12_4_,
                                                CONCAT48(fVar149 * auVar101._8_4_,
                                                         CONCAT44(fVar148 * auVar101._4_4_,
                                                                  fVar126 * auVar101._0_4_)))),
                             auVar104,ZEXT1632(auVar6));
    auVar79._28_4_ = fVar125;
    auVar79._0_28_ =
         ZEXT1628(CONCAT412(fVar150 * auVar233._12_4_,
                            CONCAT48(fVar149 * auVar233._8_4_,
                                     CONCAT44(fVar148 * auVar233._4_4_,fVar126 * auVar233._0_4_))));
    auVar94 = vfmadd231ps_fma(auVar79,auVar104,ZEXT1632(auVar94));
    auVar236 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar150 * auVar268._12_4_,
                                                  CONCAT48(fVar149 * auVar268._8_4_,
                                                           CONCAT44(fVar148 * auVar268._4_4_,
                                                                    fVar126 * auVar268._0_4_)))),
                               auVar104,ZEXT1632(auVar236));
    auVar25._4_4_ = fVar148 * local_280._4_4_;
    auVar25._0_4_ = fVar126 * (float)local_280;
    auVar25._8_4_ = fVar149 * (float)uStack_278;
    auVar25._12_4_ = fVar150 * uStack_278._4_4_;
    auVar25._16_4_ = (float)uStack_270 * 0.0;
    auVar25._20_4_ = uStack_270._4_4_ * 0.0;
    auVar25._24_4_ = (float)uStack_268 * 0.0;
    auVar25._28_4_ = (int)((ulong)uStack_228 >> 0x20);
    auVar166 = vfmadd231ps_fma(auVar22,auVar104,local_300);
    auVar160 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar166._12_4_ * fVar150,
                                                  CONCAT48(auVar166._8_4_ * fVar149,
                                                           CONCAT44(auVar166._4_4_ * fVar148,
                                                                    auVar166._0_4_ * fVar126)))),
                               auVar104,ZEXT1632(auVar160));
    auVar246._0_4_ = fVar126 * (float)local_2a0;
    auVar246._4_4_ = fVar148 * local_2a0._4_4_;
    auVar246._8_4_ = fVar149 * (float)uStack_298;
    auVar246._12_4_ = fVar150 * uStack_298._4_4_;
    auVar246._16_4_ = (float)uStack_290 * 0.0;
    auVar246._20_4_ = uStack_290._4_4_ * 0.0;
    auVar246._24_4_ = (float)uStack_288 * 0.0;
    auVar246._28_4_ = 0;
    auVar71._4_4_ = fStack_43c;
    auVar71._0_4_ = local_440;
    auVar71._8_4_ = fStack_438;
    auVar71._12_4_ = fStack_434;
    auVar71._16_4_ = fStack_430;
    auVar71._20_4_ = fStack_42c;
    auVar71._24_4_ = fStack_428;
    auVar71._28_4_ = fStack_424;
    auVar166 = vfmadd231ps_fma(auVar23,auVar104,auVar71);
    auVar70._4_4_ = fStack_45c;
    auVar70._0_4_ = local_460;
    auVar70._8_4_ = fStack_458;
    auVar70._12_4_ = fStack_454;
    auVar70._16_4_ = fStack_450;
    auVar70._20_4_ = fStack_44c;
    auVar70._24_4_ = fStack_448;
    auVar70._28_4_ = fStack_444;
    auVar96 = vfmadd231ps_fma(auVar25,auVar104,auVar70);
    auVar69._4_4_ = fStack_47c;
    auVar69._0_4_ = local_480;
    auVar69._8_4_ = fStack_478;
    auVar69._12_4_ = fStack_474;
    auVar69._16_4_ = fStack_470;
    auVar69._20_4_ = fStack_46c;
    auVar69._24_4_ = fStack_468;
    auVar69._28_4_ = fStack_464;
    auVar127 = vfmadd231ps_fma(auVar246,auVar104,auVar69);
    auVar26._28_4_ = (int)((ulong)uStack_208 >> 0x20);
    auVar26._0_28_ =
         ZEXT1628(CONCAT412(auVar127._12_4_ * fVar150,
                            CONCAT48(auVar127._8_4_ * fVar149,
                                     CONCAT44(auVar127._4_4_ * fVar148,auVar127._0_4_ * fVar126))));
    auVar101 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar166._12_4_ * fVar150,
                                                  CONCAT48(auVar166._8_4_ * fVar149,
                                                           CONCAT44(auVar166._4_4_ * fVar148,
                                                                    auVar166._0_4_ * fVar126)))),
                               auVar104,ZEXT1632(auVar101));
    auVar233 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar150 * auVar96._12_4_,
                                                  CONCAT48(fVar149 * auVar96._8_4_,
                                                           CONCAT44(fVar148 * auVar96._4_4_,
                                                                    fVar126 * auVar96._0_4_)))),
                               auVar104,ZEXT1632(auVar233));
    auVar268 = vfmadd231ps_fma(auVar26,auVar104,ZEXT1632(auVar268));
    auVar27._28_4_ = local_300._28_4_;
    auVar27._0_28_ =
         ZEXT1628(CONCAT412(auVar101._12_4_ * fVar150,
                            CONCAT48(auVar101._8_4_ * fVar149,
                                     CONCAT44(auVar101._4_4_ * fVar148,auVar101._0_4_ * fVar126))));
    auVar166 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar160._12_4_ * fVar150,
                                                  CONCAT48(auVar160._8_4_ * fVar149,
                                                           CONCAT44(auVar160._4_4_ * fVar148,
                                                                    auVar160._0_4_ * fVar126)))),
                               auVar104,ZEXT1632(auVar99));
    auVar96 = vfmadd231ps_fma(auVar27,auVar104,ZEXT1632(auVar6));
    auVar105 = ZEXT1632(auVar96);
    auVar96 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar150 * auVar233._12_4_,
                                                 CONCAT48(fVar149 * auVar233._8_4_,
                                                          CONCAT44(fVar148 * auVar233._4_4_,
                                                                   fVar126 * auVar233._0_4_)))),
                              auVar104,ZEXT1632(auVar94));
    auVar127 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar268._12_4_ * fVar150,
                                                  CONCAT48(auVar268._8_4_ * fVar149,
                                                           CONCAT44(auVar268._4_4_ * fVar148,
                                                                    auVar268._0_4_ * fVar126)))),
                               ZEXT1632(auVar236),auVar104);
    auVar224 = vsubps_avx(ZEXT1632(auVar160),ZEXT1632(auVar99));
    auVar104 = vsubps_avx(ZEXT1632(auVar101),ZEXT1632(auVar6));
    auVar107 = vsubps_avx(ZEXT1632(auVar233),ZEXT1632(auVar94));
    auVar253 = vsubps_avx(ZEXT1632(auVar268),ZEXT1632(auVar236));
    local_700._0_4_ = fVar156 * auVar224._0_4_ * 3.0;
    local_700._4_4_ = fVar156 * auVar224._4_4_ * 3.0;
    local_700._8_4_ = fVar156 * auVar224._8_4_ * 3.0;
    local_700._12_4_ = fVar156 * auVar224._12_4_ * 3.0;
    local_700._16_4_ = fVar156 * auVar224._16_4_ * 3.0;
    local_700._20_4_ = fVar156 * auVar224._20_4_ * 3.0;
    local_700._24_4_ = fVar156 * auVar224._24_4_ * 3.0;
    local_700._28_4_ = 0;
    auVar248._0_4_ = fVar156 * auVar104._0_4_ * 3.0;
    auVar248._4_4_ = fVar156 * auVar104._4_4_ * 3.0;
    auVar248._8_4_ = fVar156 * auVar104._8_4_ * 3.0;
    auVar248._12_4_ = fVar156 * auVar104._12_4_ * 3.0;
    auVar248._16_4_ = fVar156 * auVar104._16_4_ * 3.0;
    auVar248._20_4_ = fVar156 * auVar104._20_4_ * 3.0;
    auVar248._24_4_ = fVar156 * auVar104._24_4_ * 3.0;
    auVar248._28_4_ = 0;
    auVar270._0_4_ = fVar156 * auVar107._0_4_ * 3.0;
    auVar270._4_4_ = fVar156 * auVar107._4_4_ * 3.0;
    auVar270._8_4_ = fVar156 * auVar107._8_4_ * 3.0;
    auVar270._12_4_ = fVar156 * auVar107._12_4_ * 3.0;
    auVar270._16_4_ = fVar156 * auVar107._16_4_ * 3.0;
    auVar270._20_4_ = fVar156 * auVar107._20_4_ * 3.0;
    auVar270._24_4_ = fVar156 * auVar107._24_4_ * 3.0;
    auVar270._28_4_ = 0;
    fVar126 = fVar156 * auVar253._0_4_ * 3.0;
    fVar148 = fVar156 * auVar253._4_4_ * 3.0;
    auVar28._4_4_ = fVar148;
    auVar28._0_4_ = fVar126;
    fVar149 = fVar156 * auVar253._8_4_ * 3.0;
    auVar28._8_4_ = fVar149;
    fVar150 = fVar156 * auVar253._12_4_ * 3.0;
    auVar28._12_4_ = fVar150;
    fVar152 = fVar156 * auVar253._16_4_ * 3.0;
    auVar28._16_4_ = fVar152;
    fVar154 = fVar156 * auVar253._20_4_ * 3.0;
    auVar28._20_4_ = fVar154;
    fVar156 = fVar156 * auVar253._24_4_ * 3.0;
    auVar28._24_4_ = fVar156;
    auVar28._28_4_ = auVar224._28_4_;
    auVar192 = ZEXT1632(auVar166);
    auVar141 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar166));
    _local_8e0 = vpermps_avx2(_DAT_01fec480,auVar105);
    auVar171 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar96));
    auVar16 = vsubps_avx(auVar141,auVar192);
    auVar193 = vsubps_avx(auVar171,ZEXT1632(auVar96));
    fVar151 = auVar193._0_4_;
    fVar153 = auVar193._4_4_;
    auVar29._4_4_ = fVar153 * local_700._4_4_;
    auVar29._0_4_ = fVar151 * local_700._0_4_;
    fVar155 = auVar193._8_4_;
    auVar29._8_4_ = fVar155 * local_700._8_4_;
    fVar157 = auVar193._12_4_;
    auVar29._12_4_ = fVar157 * local_700._12_4_;
    fVar202 = auVar193._16_4_;
    auVar29._16_4_ = fVar202 * local_700._16_4_;
    fVar203 = auVar193._20_4_;
    auVar29._20_4_ = fVar203 * local_700._20_4_;
    fVar243 = auVar193._24_4_;
    auVar29._24_4_ = fVar243 * local_700._24_4_;
    auVar29._28_4_ = auVar141._28_4_;
    auVar99 = vfmsub231ps_fma(auVar29,auVar270,auVar16);
    auVar17 = vsubps_avx(_local_8e0,auVar105);
    fVar250 = auVar16._0_4_;
    fVar254 = auVar16._4_4_;
    auVar30._4_4_ = fVar254 * auVar248._4_4_;
    auVar30._0_4_ = fVar250 * auVar248._0_4_;
    fVar255 = auVar16._8_4_;
    auVar30._8_4_ = fVar255 * auVar248._8_4_;
    fVar256 = auVar16._12_4_;
    auVar30._12_4_ = fVar256 * auVar248._12_4_;
    fVar257 = auVar16._16_4_;
    auVar30._16_4_ = fVar257 * auVar248._16_4_;
    fVar258 = auVar16._20_4_;
    auVar30._20_4_ = fVar258 * auVar248._20_4_;
    fVar259 = auVar16._24_4_;
    auVar30._24_4_ = fVar259 * auVar248._24_4_;
    auVar30._28_4_ = local_8e0._28_4_;
    auVar6 = vfmsub231ps_fma(auVar30,local_700,auVar17);
    auVar99 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar6._12_4_ * auVar6._12_4_,
                                                 CONCAT48(auVar6._8_4_ * auVar6._8_4_,
                                                          CONCAT44(auVar6._4_4_ * auVar6._4_4_,
                                                                   auVar6._0_4_ * auVar6._0_4_)))),
                              ZEXT1632(auVar99),ZEXT1632(auVar99));
    fVar180 = auVar17._0_4_;
    fVar198 = auVar17._4_4_;
    auVar31._4_4_ = fVar198 * auVar270._4_4_;
    auVar31._0_4_ = fVar180 * auVar270._0_4_;
    fVar199 = auVar17._8_4_;
    auVar31._8_4_ = fVar199 * auVar270._8_4_;
    fVar200 = auVar17._12_4_;
    auVar31._12_4_ = fVar200 * auVar270._12_4_;
    fVar201 = auVar17._16_4_;
    auVar31._16_4_ = fVar201 * auVar270._16_4_;
    fVar262 = auVar17._20_4_;
    auVar31._20_4_ = fVar262 * auVar270._20_4_;
    fVar263 = auVar17._24_4_;
    auVar31._24_4_ = fVar263 * auVar270._24_4_;
    auVar31._28_4_ = auVar171._28_4_;
    auVar94 = vfmsub231ps_fma(auVar31,auVar248,auVar193);
    auVar172._0_4_ = fVar151 * fVar151;
    auVar172._4_4_ = fVar153 * fVar153;
    auVar172._8_4_ = fVar155 * fVar155;
    auVar172._12_4_ = fVar157 * fVar157;
    auVar172._16_4_ = fVar202 * fVar202;
    auVar172._20_4_ = fVar203 * fVar203;
    auVar172._24_4_ = fVar243 * fVar243;
    auVar172._28_4_ = 0;
    auVar6 = vfmadd231ps_fma(auVar172,auVar17,auVar17);
    auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar16,auVar16);
    auVar104 = vrcpps_avx(ZEXT1632(auVar6));
    auVar94 = vfmadd231ps_fma(ZEXT1632(auVar99),ZEXT1632(auVar94),ZEXT1632(auVar94));
    auVar265._8_4_ = 0x3f800000;
    auVar265._0_8_ = 0x3f8000003f800000;
    auVar265._12_4_ = 0x3f800000;
    auVar265._16_4_ = 0x3f800000;
    auVar265._20_4_ = 0x3f800000;
    auVar265._24_4_ = 0x3f800000;
    auVar265._28_4_ = 0x3f800000;
    auVar99 = vfnmadd213ps_fma(auVar104,ZEXT1632(auVar6),auVar265);
    auVar99 = vfmadd132ps_fma(ZEXT1632(auVar99),auVar104,auVar104);
    auVar223 = vpermps_avx2(_DAT_01fec480,local_700);
    local_960 = vpermps_avx2(_DAT_01fec480,auVar270);
    auVar32._4_4_ = auVar223._4_4_ * fVar153;
    auVar32._0_4_ = auVar223._0_4_ * fVar151;
    auVar32._8_4_ = auVar223._8_4_ * fVar155;
    auVar32._12_4_ = auVar223._12_4_ * fVar157;
    auVar32._16_4_ = auVar223._16_4_ * fVar202;
    auVar32._20_4_ = auVar223._20_4_ * fVar203;
    auVar32._24_4_ = auVar223._24_4_ * fVar243;
    auVar32._28_4_ = auVar104._28_4_;
    auVar236 = vfmsub231ps_fma(auVar32,local_960,auVar16);
    auVar237 = vpermps_avx2(_DAT_01fec480,auVar248);
    auStack_8f0 = auVar237._16_16_;
    auVar33._4_4_ = fVar254 * auVar237._4_4_;
    auVar33._0_4_ = fVar250 * auVar237._0_4_;
    auVar33._8_4_ = fVar255 * auVar237._8_4_;
    auVar33._12_4_ = fVar256 * auVar237._12_4_;
    auVar33._16_4_ = fVar257 * auVar237._16_4_;
    auVar33._20_4_ = fVar258 * auVar237._20_4_;
    auVar33._24_4_ = fVar259 * auVar237._24_4_;
    auVar33._28_4_ = 0;
    auVar160 = vfmsub231ps_fma(auVar33,auVar223,auVar17);
    auVar236 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar160._12_4_ * auVar160._12_4_,
                                                  CONCAT48(auVar160._8_4_ * auVar160._8_4_,
                                                           CONCAT44(auVar160._4_4_ * auVar160._4_4_,
                                                                    auVar160._0_4_ * auVar160._0_4_)
                                                          ))),ZEXT1632(auVar236),ZEXT1632(auVar236))
    ;
    auVar225._0_4_ = fVar180 * local_960._0_4_;
    auVar225._4_4_ = fVar198 * local_960._4_4_;
    auVar225._8_4_ = fVar199 * local_960._8_4_;
    auVar225._12_4_ = fVar200 * local_960._12_4_;
    auVar225._16_4_ = fVar201 * local_960._16_4_;
    auVar225._20_4_ = fVar262 * local_960._20_4_;
    auVar225._24_4_ = fVar263 * local_960._24_4_;
    auVar225._28_4_ = 0;
    auVar160 = vfmsub231ps_fma(auVar225,auVar237,auVar193);
    auVar236 = vfmadd231ps_fma(ZEXT1632(auVar236),ZEXT1632(auVar160),ZEXT1632(auVar160));
    auVar104 = vmaxps_avx(ZEXT1632(CONCAT412(auVar94._12_4_ * auVar99._12_4_,
                                             CONCAT48(auVar94._8_4_ * auVar99._8_4_,
                                                      CONCAT44(auVar94._4_4_ * auVar99._4_4_,
                                                               auVar94._0_4_ * auVar99._0_4_)))),
                          ZEXT1632(CONCAT412(auVar236._12_4_ * auVar99._12_4_,
                                             CONCAT48(auVar236._8_4_ * auVar99._8_4_,
                                                      CONCAT44(auVar236._4_4_ * auVar99._4_4_,
                                                               auVar236._0_4_ * auVar99._0_4_)))));
    local_760._0_4_ = auVar127._0_4_ + fVar126;
    local_760._4_4_ = auVar127._4_4_ + fVar148;
    local_760._8_4_ = auVar127._8_4_ + fVar149;
    local_760._12_4_ = auVar127._12_4_ + fVar150;
    local_760._16_4_ = fVar152 + 0.0;
    local_760._20_4_ = fVar154 + 0.0;
    local_760._24_4_ = fVar156 + 0.0;
    local_760._28_4_ = auVar224._28_4_ + 0.0;
    local_740 = ZEXT1632(auVar127);
    auVar224 = vsubps_avx(local_740,auVar28);
    local_780 = vpermps_avx2(_DAT_01fec480,auVar224);
    auVar238 = vpermps_avx2(_DAT_01fec480,local_740);
    auStack_790 = auVar238._16_16_;
    auVar224 = vmaxps_avx(local_740,local_760);
    auVar107 = vmaxps_avx(local_780,auVar238);
    auVar253 = vrsqrtps_avx(ZEXT1632(auVar6));
    auVar224 = vmaxps_avx(auVar224,auVar107);
    fVar126 = auVar253._0_4_;
    fVar148 = auVar253._4_4_;
    fVar149 = auVar253._8_4_;
    fVar150 = auVar253._12_4_;
    fVar156 = auVar253._16_4_;
    fVar152 = auVar253._20_4_;
    fVar154 = auVar253._24_4_;
    auVar34._4_4_ = fVar148 * fVar148 * fVar148 * auVar6._4_4_ * -0.5;
    auVar34._0_4_ = fVar126 * fVar126 * fVar126 * auVar6._0_4_ * -0.5;
    auVar34._8_4_ = fVar149 * fVar149 * fVar149 * auVar6._8_4_ * -0.5;
    auVar34._12_4_ = fVar150 * fVar150 * fVar150 * auVar6._12_4_ * -0.5;
    auVar34._16_4_ = fVar156 * fVar156 * fVar156 * -0.0;
    auVar34._20_4_ = fVar152 * fVar152 * fVar152 * -0.0;
    auVar34._24_4_ = fVar154 * fVar154 * fVar154 * -0.0;
    auVar34._28_4_ = auVar237._28_4_;
    auVar106._8_4_ = 0x3fc00000;
    auVar106._0_8_ = 0x3fc000003fc00000;
    auVar106._12_4_ = 0x3fc00000;
    auVar106._16_4_ = 0x3fc00000;
    auVar106._20_4_ = 0x3fc00000;
    auVar106._24_4_ = 0x3fc00000;
    auVar106._28_4_ = 0x3fc00000;
    auVar99 = vfmadd231ps_fma(auVar34,auVar106,auVar253);
    auVar249 = ZEXT1664(auVar99);
    fVar148 = auVar99._0_4_;
    fVar149 = auVar99._4_4_;
    auVar35._4_4_ = fVar198 * fVar149;
    auVar35._0_4_ = fVar180 * fVar148;
    fVar156 = auVar99._8_4_;
    auVar35._8_4_ = fVar199 * fVar156;
    fVar154 = auVar99._12_4_;
    auVar35._12_4_ = fVar200 * fVar154;
    auVar35._16_4_ = fVar201 * 0.0;
    auVar35._20_4_ = fVar262 * 0.0;
    uVar92 = auVar253._28_4_;
    auVar35._24_4_ = fVar263 * 0.0;
    auVar35._28_4_ = uVar92;
    auVar36._4_4_ = fVar91 * fVar149 * fVar153;
    auVar36._0_4_ = fVar91 * fVar148 * fVar151;
    auVar36._8_4_ = fVar91 * fVar156 * fVar155;
    auVar36._12_4_ = fVar91 * fVar154 * fVar157;
    auVar36._16_4_ = fVar91 * fVar202 * 0.0;
    auVar36._20_4_ = fVar91 * fVar203 * 0.0;
    auVar36._24_4_ = fVar91 * fVar243 * 0.0;
    auVar36._28_4_ = auVar17._28_4_;
    auVar99 = vfmadd231ps_fma(auVar36,auVar35,_local_9a0);
    auVar277 = ZEXT1632(auVar96);
    auVar107 = ZEXT1232(ZEXT812(0)) << 0x20;
    auVar253 = vsubps_avx(auVar107,auVar277);
    fVar180 = auVar253._0_4_;
    auVar278._0_4_ = fVar180 * fVar148 * fVar151;
    fVar198 = auVar253._4_4_;
    auVar278._4_4_ = fVar198 * fVar149 * fVar153;
    fVar199 = auVar253._8_4_;
    auVar278._8_4_ = fVar199 * fVar156 * fVar155;
    fVar200 = auVar253._12_4_;
    auVar278._12_4_ = fVar200 * fVar154 * fVar157;
    fVar201 = auVar253._16_4_;
    auVar278._16_4_ = fVar201 * fVar202 * 0.0;
    fVar202 = auVar253._20_4_;
    auVar278._20_4_ = fVar202 * fVar203 * 0.0;
    fVar203 = auVar253._24_4_;
    auVar278._24_4_ = fVar203 * fVar243 * 0.0;
    auVar278._28_4_ = 0;
    auVar173 = vsubps_avx(auVar107,auVar105);
    auVar6 = vfmadd231ps_fma(auVar278,auVar173,auVar35);
    auVar37._4_4_ = fVar254 * fVar149;
    auVar37._0_4_ = fVar250 * fVar148;
    auVar37._8_4_ = fVar255 * fVar156;
    auVar37._12_4_ = fVar256 * fVar154;
    auVar37._16_4_ = fVar257 * 0.0;
    auVar37._20_4_ = fVar258 * 0.0;
    auVar37._24_4_ = fVar259 * 0.0;
    auVar37._28_4_ = uVar92;
    auVar99 = vfmadd231ps_fma(ZEXT1632(auVar99),auVar37,_local_7c0);
    auVar261 = ZEXT1664(auVar99);
    auVar108 = ZEXT1232(ZEXT812(0)) << 0x20;
    auVar215 = vsubps_avx(auVar108,auVar192);
    auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar215,auVar37);
    auVar279 = ZEXT1664(auVar6);
    auVar38._4_4_ = fVar91 * fVar198;
    auVar38._0_4_ = fVar91 * fVar180;
    auVar38._8_4_ = fVar91 * fVar199;
    auVar38._12_4_ = fVar91 * fVar200;
    auVar38._16_4_ = fVar91 * fVar201;
    auVar38._20_4_ = fVar91 * fVar202;
    auVar38._24_4_ = fVar91 * fVar203;
    auVar38._28_4_ = uVar92;
    auVar94 = vfmadd231ps_fma(auVar38,_local_9a0,auVar173);
    auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),_local_7c0,auVar215);
    fVar126 = auVar6._0_4_;
    fVar243 = auVar99._0_4_;
    fVar150 = auVar6._4_4_;
    fVar250 = auVar99._4_4_;
    fVar152 = auVar6._8_4_;
    fVar254 = auVar99._8_4_;
    fVar151 = auVar6._12_4_;
    fVar255 = auVar99._12_4_;
    auVar39._28_4_ = fVar91;
    auVar39._0_28_ =
         ZEXT1628(CONCAT412(fVar255 * fVar151,
                            CONCAT48(fVar254 * fVar152,CONCAT44(fVar250 * fVar150,fVar243 * fVar126)
                                    )));
    auVar14 = vsubps_avx(ZEXT1632(auVar94),auVar39);
    auVar40._4_4_ = fVar198 * fVar198;
    auVar40._0_4_ = fVar180 * fVar180;
    auVar40._8_4_ = fVar199 * fVar199;
    auVar40._12_4_ = fVar200 * fVar200;
    auVar40._16_4_ = fVar201 * fVar201;
    auVar40._20_4_ = fVar202 * fVar202;
    auVar40._24_4_ = fVar203 * fVar203;
    auVar40._28_4_ = fVar91;
    auVar94 = vfmadd231ps_fma(auVar40,auVar173,auVar173);
    auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar215,auVar215);
    auVar41._28_4_ = auVar16._28_4_;
    auVar41._0_28_ =
         ZEXT1628(CONCAT412(fVar151 * fVar151,
                            CONCAT48(fVar152 * fVar152,CONCAT44(fVar150 * fVar150,fVar126 * fVar126)
                                    )));
    auVar15 = vsubps_avx(ZEXT1632(auVar94),auVar41);
    auVar107 = vsqrtps_avx(auVar104);
    fVar126 = (auVar107._0_4_ + auVar224._0_4_) * 1.0000002;
    fVar150 = (auVar107._4_4_ + auVar224._4_4_) * 1.0000002;
    fVar152 = (auVar107._8_4_ + auVar224._8_4_) * 1.0000002;
    fVar151 = (auVar107._12_4_ + auVar224._12_4_) * 1.0000002;
    fVar153 = (auVar107._16_4_ + auVar224._16_4_) * 1.0000002;
    fVar155 = (auVar107._20_4_ + auVar224._20_4_) * 1.0000002;
    fVar157 = (auVar107._24_4_ + auVar224._24_4_) * 1.0000002;
    auVar42._4_4_ = fVar150 * fVar150;
    auVar42._0_4_ = fVar126 * fVar126;
    auVar42._8_4_ = fVar152 * fVar152;
    auVar42._12_4_ = fVar151 * fVar151;
    auVar42._16_4_ = fVar153 * fVar153;
    auVar42._20_4_ = fVar155 * fVar155;
    auVar42._24_4_ = fVar157 * fVar157;
    auVar42._28_4_ = auVar107._28_4_ + auVar224._28_4_;
    auVar271._0_4_ = auVar14._0_4_ + auVar14._0_4_;
    auVar271._4_4_ = auVar14._4_4_ + auVar14._4_4_;
    auVar271._8_4_ = auVar14._8_4_ + auVar14._8_4_;
    auVar271._12_4_ = auVar14._12_4_ + auVar14._12_4_;
    auVar271._16_4_ = auVar14._16_4_ + auVar14._16_4_;
    auVar271._20_4_ = auVar14._20_4_ + auVar14._20_4_;
    auVar271._24_4_ = auVar14._24_4_ + auVar14._24_4_;
    auVar271._28_4_ = auVar14._28_4_ + auVar14._28_4_;
    auVar224 = vsubps_avx(auVar15,auVar42);
    auVar260 = ZEXT1632(auVar99);
    auVar43._28_4_ = local_7c0._28_4_;
    auVar43._0_28_ =
         ZEXT1628(CONCAT412(fVar255 * fVar255,
                            CONCAT48(fVar254 * fVar254,CONCAT44(fVar250 * fVar250,fVar243 * fVar243)
                                    )));
    local_4e0 = vsubps_avx(local_2c0,auVar43);
    auVar44._4_4_ = auVar271._4_4_ * auVar271._4_4_;
    auVar44._0_4_ = auVar271._0_4_ * auVar271._0_4_;
    auVar44._8_4_ = auVar271._8_4_ * auVar271._8_4_;
    auVar44._12_4_ = auVar271._12_4_ * auVar271._12_4_;
    auVar44._16_4_ = auVar271._16_4_ * auVar271._16_4_;
    auVar44._20_4_ = auVar271._20_4_ * auVar271._20_4_;
    auVar44._24_4_ = auVar271._24_4_ * auVar271._24_4_;
    auVar44._28_4_ = 0x3f800002;
    fVar150 = local_4e0._0_4_;
    fVar152 = local_4e0._4_4_;
    fVar151 = local_4e0._8_4_;
    fVar153 = local_4e0._12_4_;
    fVar155 = local_4e0._16_4_;
    fVar157 = local_4e0._20_4_;
    fVar243 = local_4e0._24_4_;
    auVar45._4_4_ = auVar224._4_4_ * fVar152 * 4.0;
    auVar45._0_4_ = auVar224._0_4_ * fVar150 * 4.0;
    auVar45._8_4_ = auVar224._8_4_ * fVar151 * 4.0;
    auVar45._12_4_ = auVar224._12_4_ * fVar153 * 4.0;
    auVar45._16_4_ = auVar224._16_4_ * fVar155 * 4.0;
    auVar45._20_4_ = auVar224._20_4_ * fVar157 * 4.0;
    auVar45._24_4_ = auVar224._24_4_ * fVar243 * 4.0;
    auVar45._28_4_ = 0x40800000;
    auVar14 = vsubps_avx(auVar44,auVar45);
    auVar104 = vcmpps_avx(auVar14,auVar108,5);
    auVar108 = ZEXT1632(auVar6);
    fVar126 = local_4e0._28_4_;
    if ((((((((auVar104 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar104 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar104 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar104 >> 0x7f,0) == '\0') &&
          (auVar104 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar104 >> 0xbf,0) == '\0') &&
        (auVar104 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar104[0x1f])
    {
      auVar239._8_4_ = 0x7f800000;
      auVar239._0_8_ = 0x7f8000007f800000;
      auVar239._12_4_ = 0x7f800000;
      auVar239._16_4_ = 0x7f800000;
      auVar239._20_4_ = 0x7f800000;
      auVar239._24_4_ = 0x7f800000;
      auVar239._28_4_ = 0x7f800000;
      auVar211._8_4_ = 0xff800000;
      auVar211._0_8_ = 0xff800000ff800000;
      auVar211._12_4_ = 0xff800000;
      auVar211._16_4_ = 0xff800000;
      auVar211._20_4_ = 0xff800000;
      auVar211._24_4_ = 0xff800000;
      auVar211._28_4_ = 0xff800000;
    }
    else {
      auVar13 = vsqrtps_avx(auVar14);
      auVar109._0_4_ = fVar150 + fVar150;
      auVar109._4_4_ = fVar152 + fVar152;
      auVar109._8_4_ = fVar151 + fVar151;
      auVar109._12_4_ = fVar153 + fVar153;
      auVar109._16_4_ = fVar155 + fVar155;
      auVar109._20_4_ = fVar157 + fVar157;
      auVar109._24_4_ = fVar243 + fVar243;
      auVar109._28_4_ = fVar126 + fVar126;
      auVar12 = vrcpps_avx(auVar109);
      auVar276 = vcmpps_avx(auVar14,ZEXT832(0) << 0x20,5);
      auVar212._8_4_ = 0x3f800000;
      auVar212._0_8_ = 0x3f8000003f800000;
      auVar212._12_4_ = 0x3f800000;
      auVar212._16_4_ = 0x3f800000;
      auVar212._20_4_ = 0x3f800000;
      auVar212._24_4_ = 0x3f800000;
      auVar212._28_4_ = 0x3f800000;
      auVar99 = vfnmadd213ps_fma(auVar109,auVar12,auVar212);
      auVar99 = vfmadd132ps_fma(ZEXT1632(auVar99),auVar12,auVar12);
      auVar213._0_4_ = (uint)auVar271._0_4_ ^ local_5e0;
      auVar213._4_4_ = (uint)auVar271._4_4_ ^ uStack_5dc;
      auVar213._8_4_ = (uint)auVar271._8_4_ ^ uStack_5d8;
      auVar213._12_4_ = (uint)auVar271._12_4_ ^ uStack_5d4;
      auVar213._16_4_ = (uint)auVar271._16_4_ ^ (uint)fStack_5d0;
      auVar213._20_4_ = (uint)auVar271._20_4_ ^ (uint)fStack_5cc;
      auVar213._24_4_ = (uint)auVar271._24_4_ ^ (uint)fStack_5c8;
      auVar213._28_4_ = (uint)auVar271._28_4_ ^ uStack_5c4;
      auVar12 = vsubps_avx(auVar213,auVar13);
      auVar46._4_4_ = auVar12._4_4_ * auVar99._4_4_;
      auVar46._0_4_ = auVar12._0_4_ * auVar99._0_4_;
      auVar46._8_4_ = auVar12._8_4_ * auVar99._8_4_;
      auVar46._12_4_ = auVar12._12_4_ * auVar99._12_4_;
      auVar46._16_4_ = auVar12._16_4_ * 0.0;
      auVar46._20_4_ = auVar12._20_4_ * 0.0;
      auVar46._24_4_ = auVar12._24_4_ * 0.0;
      auVar46._28_4_ = auVar12._28_4_;
      auVar14 = vsubps_avx(auVar13,auVar271);
      auVar110._0_4_ = auVar14._0_4_ * auVar99._0_4_;
      auVar110._4_4_ = auVar14._4_4_ * auVar99._4_4_;
      auVar110._8_4_ = auVar14._8_4_ * auVar99._8_4_;
      auVar110._12_4_ = auVar14._12_4_ * auVar99._12_4_;
      auVar110._16_4_ = auVar14._16_4_ * 0.0;
      auVar110._20_4_ = auVar14._20_4_ * 0.0;
      auVar110._24_4_ = auVar14._24_4_ * 0.0;
      auVar110._28_4_ = 0;
      auVar99 = vfmadd213ps_fma(auVar260,auVar46,auVar108);
      local_380 = ZEXT1632(CONCAT412(fVar154 * auVar99._12_4_,
                                     CONCAT48(fVar156 * auVar99._8_4_,
                                              CONCAT44(fVar149 * auVar99._4_4_,
                                                       fVar148 * auVar99._0_4_))));
      auVar14 = vandps_avx(local_800,auVar43);
      auVar14 = vmaxps_avx(local_4c0,auVar14);
      auVar47._4_4_ = auVar14._4_4_ * 1.9073486e-06;
      auVar47._0_4_ = auVar14._0_4_ * 1.9073486e-06;
      auVar47._8_4_ = auVar14._8_4_ * 1.9073486e-06;
      auVar47._12_4_ = auVar14._12_4_ * 1.9073486e-06;
      auVar47._16_4_ = auVar14._16_4_ * 1.9073486e-06;
      auVar47._20_4_ = auVar14._20_4_ * 1.9073486e-06;
      auVar47._24_4_ = auVar14._24_4_ * 1.9073486e-06;
      auVar47._28_4_ = auVar14._28_4_;
      auVar14 = vandps_avx(local_4e0,local_800);
      auVar14 = vcmpps_avx(auVar14,auVar47,1);
      auVar99 = vfmadd213ps_fma(auVar260,auVar110,auVar108);
      auVar240._8_4_ = 0x7f800000;
      auVar240._0_8_ = 0x7f8000007f800000;
      auVar240._12_4_ = 0x7f800000;
      auVar240._16_4_ = 0x7f800000;
      auVar240._20_4_ = 0x7f800000;
      auVar240._24_4_ = 0x7f800000;
      auVar240._28_4_ = 0x7f800000;
      auVar239 = vblendvps_avx(auVar240,auVar46,auVar276);
      local_3a0 = fVar148 * auVar99._0_4_;
      fStack_39c = fVar149 * auVar99._4_4_;
      fStack_398 = fVar156 * auVar99._8_4_;
      fStack_394 = fVar154 * auVar99._12_4_;
      uStack_390 = 0;
      uStack_38c = 0;
      uStack_388 = 0;
      uStack_384 = auVar12._28_4_;
      auVar214._8_4_ = 0xff800000;
      auVar214._0_8_ = 0xff800000ff800000;
      auVar214._12_4_ = 0xff800000;
      auVar214._16_4_ = 0xff800000;
      auVar214._20_4_ = 0xff800000;
      auVar214._24_4_ = 0xff800000;
      auVar214._28_4_ = 0xff800000;
      auVar211 = vblendvps_avx(auVar214,auVar110,auVar276);
      auVar12 = auVar276 & auVar14;
      if ((((((((auVar12 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar12 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar12 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar12 >> 0x7f,0) != '\0') ||
            (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar12 >> 0xbf,0) != '\0') ||
          (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar12[0x1f] < '\0') {
        auVar104 = vandps_avx(auVar14,auVar276);
        auVar14 = vcmpps_avx(auVar224,ZEXT832(0) << 0x20,2);
        auVar275._8_4_ = 0xff800000;
        auVar275._0_8_ = 0xff800000ff800000;
        auVar275._12_4_ = 0xff800000;
        auVar275._16_4_ = 0xff800000;
        auVar275._20_4_ = 0xff800000;
        auVar275._24_4_ = 0xff800000;
        auVar275._28_4_ = 0xff800000;
        auVar242._8_4_ = 0x7f800000;
        auVar242._0_8_ = 0x7f8000007f800000;
        auVar242._12_4_ = 0x7f800000;
        auVar242._16_4_ = 0x7f800000;
        auVar242._20_4_ = 0x7f800000;
        auVar242._24_4_ = 0x7f800000;
        auVar242._28_4_ = 0x7f800000;
        auVar224 = vblendvps_avx(auVar242,auVar275,auVar14);
        auVar99 = vpackssdw_avx(auVar104._0_16_,auVar104._16_16_);
        auVar12 = vpmovsxwd_avx2(auVar99);
        auVar239 = vblendvps_avx(auVar239,auVar224,auVar12);
        auVar224 = vblendvps_avx(auVar275,auVar242,auVar14);
        auVar211 = vblendvps_avx(auVar211,auVar224,auVar12);
        auVar120._0_8_ = auVar104._0_8_ ^ 0xffffffffffffffff;
        auVar120._8_4_ = auVar104._8_4_ ^ 0xffffffff;
        auVar120._12_4_ = auVar104._12_4_ ^ 0xffffffff;
        auVar120._16_4_ = auVar104._16_4_ ^ 0xffffffff;
        auVar120._20_4_ = auVar104._20_4_ ^ 0xffffffff;
        auVar120._24_4_ = auVar104._24_4_ ^ 0xffffffff;
        auVar120._28_4_ = auVar104._28_4_ ^ 0xffffffff;
        auVar104 = vorps_avx(auVar14,auVar120);
        auVar104 = vandps_avx(auVar276,auVar104);
      }
    }
    auVar224 = local_600 & auVar104;
    if ((((((((auVar224 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar224 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar224 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar224 >> 0x7f,0) != '\0') ||
          (auVar224 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar224 >> 0xbf,0) != '\0') ||
        (auVar224 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar224[0x1f] < '\0') {
      fVar250 = *(float *)(ray + k * 4 + 0x80);
      local_500 = ZEXT416((uint)fVar250);
      fVar254 = fVar250 - (float)local_8a0._0_4_;
      auVar111._4_4_ = fVar254;
      auVar111._0_4_ = fVar254;
      auVar111._8_4_ = fVar254;
      auVar111._12_4_ = fVar254;
      auVar111._16_4_ = fVar254;
      auVar111._20_4_ = fVar254;
      auVar111._24_4_ = fVar254;
      auVar111._28_4_ = fVar254;
      auVar14 = vminps_avx(auVar111,auVar211);
      auVar48._4_4_ = fVar198 * auVar270._4_4_;
      auVar48._0_4_ = fVar180 * auVar270._0_4_;
      auVar48._8_4_ = fVar199 * auVar270._8_4_;
      auVar48._12_4_ = fVar200 * auVar270._12_4_;
      auVar48._16_4_ = fVar201 * auVar270._16_4_;
      auVar48._20_4_ = fVar202 * auVar270._20_4_;
      auVar48._24_4_ = fVar203 * auVar270._24_4_;
      auVar48._28_4_ = auVar253._28_4_;
      auVar99 = vfmadd213ps_fma(auVar173,auVar248,auVar48);
      auVar73._4_4_ = fStack_33c;
      auVar73._0_4_ = local_340;
      auVar73._8_4_ = fStack_338;
      auVar73._12_4_ = fStack_334;
      auVar73._16_4_ = fStack_330;
      auVar73._20_4_ = fStack_32c;
      auVar73._24_4_ = fStack_328;
      auVar73._28_4_ = fStack_324;
      auVar173 = vmaxps_avx(auVar73,auVar239);
      auVar6 = vfmadd213ps_fma(auVar215,local_700,ZEXT1632(auVar99));
      auVar49._4_4_ = auVar270._4_4_ * fVar91;
      auVar49._0_4_ = auVar270._0_4_ * fVar91;
      auVar49._8_4_ = auVar270._8_4_ * fVar91;
      auVar49._12_4_ = auVar270._12_4_ * fVar91;
      auVar49._16_4_ = auVar270._16_4_ * fVar91;
      auVar49._20_4_ = auVar270._20_4_ * fVar91;
      auVar49._24_4_ = auVar270._24_4_ * fVar91;
      auVar49._28_4_ = 0;
      auVar99 = vfmadd231ps_fma(auVar49,_local_9a0,auVar248);
      auVar94 = vfmadd231ps_fma(ZEXT1632(auVar99),_local_7c0,local_700);
      auVar224 = vandps_avx(local_800,ZEXT1632(auVar94));
      auVar273._8_4_ = 0x219392ef;
      auVar273._0_8_ = 0x219392ef219392ef;
      auVar273._12_4_ = 0x219392ef;
      auVar273._16_4_ = 0x219392ef;
      auVar273._20_4_ = 0x219392ef;
      auVar273._24_4_ = 0x219392ef;
      auVar273._28_4_ = 0x219392ef;
      auVar253 = vcmpps_avx(auVar224,auVar273,1);
      auVar224 = vrcpps_avx(ZEXT1632(auVar94));
      auVar274._8_4_ = 0x3f800000;
      auVar274._0_8_ = 0x3f8000003f800000;
      auVar274._12_4_ = 0x3f800000;
      auVar274._16_4_ = 0x3f800000;
      auVar274._20_4_ = 0x3f800000;
      auVar274._24_4_ = 0x3f800000;
      auVar274._28_4_ = 0x3f800000;
      auVar215 = ZEXT1632(auVar94);
      auVar99 = vfnmadd213ps_fma(auVar224,auVar215,auVar274);
      auVar99 = vfmadd132ps_fma(ZEXT1632(auVar99),auVar224,auVar224);
      auVar266._0_4_ = auVar94._0_4_ ^ local_5e0;
      auVar266._4_4_ = auVar94._4_4_ ^ uStack_5dc;
      auVar266._8_4_ = auVar94._8_4_ ^ uStack_5d8;
      auVar266._12_4_ = auVar94._12_4_ ^ uStack_5d4;
      auVar266._16_4_ = fStack_5d0;
      auVar266._20_4_ = fStack_5cc;
      auVar266._24_4_ = fStack_5c8;
      auVar266._28_4_ = uStack_5c4;
      auVar50._4_4_ = auVar99._4_4_ * (float)(auVar6._4_4_ ^ uStack_5dc);
      auVar50._0_4_ = auVar99._0_4_ * (float)(auVar6._0_4_ ^ local_5e0);
      auVar50._8_4_ = auVar99._8_4_ * (float)(auVar6._8_4_ ^ uStack_5d8);
      auVar50._12_4_ = auVar99._12_4_ * (float)(auVar6._12_4_ ^ uStack_5d4);
      auVar50._16_4_ = fStack_5d0 * 0.0;
      auVar50._20_4_ = fStack_5cc * 0.0;
      auVar50._24_4_ = fStack_5c8 * 0.0;
      auVar50._28_4_ = uStack_5c4;
      auVar224 = vcmpps_avx(auVar215,auVar266,1);
      auVar224 = vorps_avx(auVar253,auVar224);
      auVar252._8_4_ = 0xff800000;
      auVar252._0_8_ = 0xff800000ff800000;
      auVar252._12_4_ = 0xff800000;
      auVar252._16_4_ = 0xff800000;
      auVar252._20_4_ = 0xff800000;
      auVar252._24_4_ = 0xff800000;
      auVar252._28_4_ = 0xff800000;
      auVar224 = vblendvps_avx(auVar50,auVar252,auVar224);
      auVar173 = vmaxps_avx(auVar173,auVar224);
      auVar224 = vcmpps_avx(auVar215,auVar266,6);
      auVar224 = vorps_avx(auVar253,auVar224);
      auVar216._8_4_ = 0x7f800000;
      auVar216._0_8_ = 0x7f8000007f800000;
      auVar216._12_4_ = 0x7f800000;
      auVar216._16_4_ = 0x7f800000;
      auVar216._20_4_ = 0x7f800000;
      auVar216._24_4_ = 0x7f800000;
      auVar216._28_4_ = 0x7f800000;
      auVar224 = vblendvps_avx(auVar50,auVar216,auVar224);
      auVar215 = vminps_avx(auVar14,auVar224);
      fVar180 = (float)(local_5e0 ^ (uint)local_960._0_4_);
      fVar198 = (float)(uStack_5dc ^ (uint)local_960._4_4_);
      fVar199 = (float)(uStack_5d8 ^ (uint)local_960._8_4_);
      fVar200 = (float)(uStack_5d4 ^ (uint)local_960._12_4_);
      fVar201 = (float)((uint)fStack_5d0 ^ (uint)local_960._16_4_);
      fVar202 = (float)((uint)fStack_5cc ^ (uint)local_960._20_4_);
      fVar203 = (float)((uint)fStack_5c8 ^ (uint)local_960._24_4_);
      auVar217._0_4_ = local_5e0 ^ (uint)auVar237._0_4_;
      auVar217._4_4_ = uStack_5dc ^ (uint)auVar237._4_4_;
      auVar217._8_4_ = uStack_5d8 ^ (uint)auVar237._8_4_;
      auVar217._12_4_ = uStack_5d4 ^ (uint)auVar237._12_4_;
      auVar217._16_4_ = (uint)fStack_5d0 ^ (uint)auVar237._16_4_;
      auVar217._20_4_ = (uint)fStack_5cc ^ (uint)auVar237._20_4_;
      auVar217._24_4_ = (uint)fStack_5c8 ^ (uint)auVar237._24_4_;
      auVar217._28_4_ = uStack_5c4 ^ auVar237._28_4_;
      auVar253 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar224 = vsubps_avx(auVar253,_local_8e0);
      auVar253 = vsubps_avx(auVar253,auVar171);
      auVar51._4_4_ = auVar253._4_4_ * fVar198;
      auVar51._0_4_ = auVar253._0_4_ * fVar180;
      auVar51._8_4_ = auVar253._8_4_ * fVar199;
      auVar51._12_4_ = auVar253._12_4_ * fVar200;
      auVar51._16_4_ = auVar253._16_4_ * fVar201;
      auVar51._20_4_ = auVar253._20_4_ * fVar202;
      auVar51._24_4_ = auVar253._24_4_ * fVar203;
      auVar51._28_4_ = auVar253._28_4_;
      auVar99 = vfmadd231ps_fma(auVar51,auVar217,auVar224);
      uStack_ae4 = auVar223._28_4_;
      auVar226._0_4_ = local_5e0 ^ (uint)auVar223._0_4_;
      auVar226._4_4_ = uStack_5dc ^ (uint)auVar223._4_4_;
      auVar226._8_4_ = uStack_5d8 ^ (uint)auVar223._8_4_;
      auVar226._12_4_ = uStack_5d4 ^ (uint)auVar223._12_4_;
      auVar226._16_4_ = (uint)fStack_5d0 ^ (uint)auVar223._16_4_;
      auVar226._20_4_ = (uint)fStack_5cc ^ (uint)auVar223._20_4_;
      auVar226._24_4_ = (uint)fStack_5c8 ^ (uint)auVar223._24_4_;
      auVar226._28_4_ = uStack_5c4 ^ uStack_ae4;
      auVar224 = vsubps_avx(ZEXT1232(ZEXT812(0)) << 0x20,auVar141);
      auVar6 = vfmadd231ps_fma(ZEXT1632(auVar99),auVar226,auVar224);
      auVar52._4_4_ = fVar198 * fVar91;
      auVar52._0_4_ = fVar180 * fVar91;
      auVar52._8_4_ = fVar199 * fVar91;
      auVar52._12_4_ = fVar200 * fVar91;
      auVar52._16_4_ = fVar201 * fVar91;
      auVar52._20_4_ = fVar202 * fVar91;
      auVar52._24_4_ = fVar203 * fVar91;
      auVar52._28_4_ = uStack_5c4 ^ local_960._28_4_;
      auVar99 = vfmadd231ps_fma(auVar52,_local_9a0,auVar217);
      auVar94 = vfmadd231ps_fma(ZEXT1632(auVar99),_local_7c0,auVar226);
      auVar224 = vandps_avx(local_800,ZEXT1632(auVar94));
      auVar14 = vrcpps_avx(ZEXT1632(auVar94));
      auVar241._8_4_ = 0x219392ef;
      auVar241._0_8_ = 0x219392ef219392ef;
      auVar241._12_4_ = 0x219392ef;
      auVar241._16_4_ = 0x219392ef;
      auVar241._20_4_ = 0x219392ef;
      auVar241._24_4_ = 0x219392ef;
      auVar241._28_4_ = 0x219392ef;
      auVar253 = vcmpps_avx(auVar224,auVar241,1);
      auVar141 = ZEXT1632(auVar94);
      auVar99 = vfnmadd213ps_fma(auVar14,auVar141,auVar274);
      auVar99 = vfmadd132ps_fma(ZEXT1632(auVar99),auVar14,auVar14);
      auVar227._0_4_ = auVar94._0_4_ ^ local_5e0;
      auVar227._4_4_ = auVar94._4_4_ ^ uStack_5dc;
      auVar227._8_4_ = auVar94._8_4_ ^ uStack_5d8;
      auVar227._12_4_ = auVar94._12_4_ ^ uStack_5d4;
      auVar227._16_4_ = fStack_5d0;
      auVar227._20_4_ = fStack_5cc;
      auVar227._24_4_ = fStack_5c8;
      auVar227._28_4_ = uStack_5c4;
      auVar53._4_4_ = auVar99._4_4_ * (float)(auVar6._4_4_ ^ uStack_5dc);
      auVar53._0_4_ = auVar99._0_4_ * (float)(auVar6._0_4_ ^ local_5e0);
      auVar53._8_4_ = auVar99._8_4_ * (float)(auVar6._8_4_ ^ uStack_5d8);
      auVar53._12_4_ = auVar99._12_4_ * (float)(auVar6._12_4_ ^ uStack_5d4);
      auVar53._16_4_ = fStack_5d0 * 0.0;
      auVar53._20_4_ = fStack_5cc * 0.0;
      auVar53._24_4_ = fStack_5c8 * 0.0;
      auVar53._28_4_ = uStack_5c4;
      auVar224 = vcmpps_avx(auVar141,auVar227,1);
      auVar224 = vorps_avx(auVar224,auVar253);
      auVar112._8_4_ = 0xff800000;
      auVar112._0_8_ = 0xff800000ff800000;
      auVar112._12_4_ = 0xff800000;
      auVar112._16_4_ = 0xff800000;
      auVar112._20_4_ = 0xff800000;
      auVar112._24_4_ = 0xff800000;
      auVar112._28_4_ = 0xff800000;
      auVar224 = vblendvps_avx(auVar53,auVar112,auVar224);
      _local_7e0 = vmaxps_avx(auVar173,auVar224);
      auVar224 = vcmpps_avx(auVar141,auVar227,6);
      auVar224 = vorps_avx(auVar253,auVar224);
      auVar113._8_4_ = 0x7f800000;
      auVar113._0_8_ = 0x7f8000007f800000;
      auVar113._12_4_ = 0x7f800000;
      auVar113._16_4_ = 0x7f800000;
      auVar113._20_4_ = 0x7f800000;
      auVar113._24_4_ = 0x7f800000;
      auVar113._28_4_ = 0x7f800000;
      auVar224 = vblendvps_avx(auVar53,auVar113,auVar224);
      auVar104 = vandps_avx(local_600,auVar104);
      local_3c0 = vminps_avx(auVar215,auVar224);
      auVar224 = vcmpps_avx(_local_7e0,local_3c0,2);
      auVar253 = auVar104 & auVar224;
      if ((((((((auVar253 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar253 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar253 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar253 >> 0x7f,0) != '\0') ||
            (auVar253 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar253 >> 0xbf,0) != '\0') ||
          (auVar253 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar253[0x1f] < '\0') {
        auVar253 = vminps_avx(local_380,auVar274);
        auVar253 = vmaxps_avx(auVar253,ZEXT832(0) << 0x20);
        auVar72._4_4_ = fStack_39c;
        auVar72._0_4_ = local_3a0;
        auVar72._8_4_ = fStack_398;
        auVar72._12_4_ = fStack_394;
        auVar72._16_4_ = uStack_390;
        auVar72._20_4_ = uStack_38c;
        auVar72._24_4_ = uStack_388;
        auVar72._28_4_ = uStack_384;
        auVar173 = vminps_avx(auVar72,auVar274);
        auVar173 = vmaxps_avx(auVar173,ZEXT832(0) << 0x20);
        auVar54._4_4_ = (auVar253._4_4_ + 1.0) * 0.125;
        auVar54._0_4_ = (auVar253._0_4_ + 0.0) * 0.125;
        auVar54._8_4_ = (auVar253._8_4_ + 2.0) * 0.125;
        auVar54._12_4_ = (auVar253._12_4_ + 3.0) * 0.125;
        auVar54._16_4_ = (auVar253._16_4_ + 4.0) * 0.125;
        auVar54._20_4_ = (auVar253._20_4_ + 5.0) * 0.125;
        auVar54._24_4_ = (auVar253._24_4_ + 6.0) * 0.125;
        auVar54._28_4_ = auVar253._28_4_ + 7.0;
        auVar99 = vfmadd213ps_fma(auVar54,local_980,local_720);
        auVar55._4_4_ = (auVar173._4_4_ + 1.0) * 0.125;
        auVar55._0_4_ = (auVar173._0_4_ + 0.0) * 0.125;
        auVar55._8_4_ = (auVar173._8_4_ + 2.0) * 0.125;
        auVar55._12_4_ = (auVar173._12_4_ + 3.0) * 0.125;
        auVar55._16_4_ = (auVar173._16_4_ + 4.0) * 0.125;
        auVar55._20_4_ = (auVar173._20_4_ + 5.0) * 0.125;
        auVar55._24_4_ = (auVar173._24_4_ + 6.0) * 0.125;
        auVar55._28_4_ = auVar173._28_4_ + 7.0;
        auVar6 = vfmadd213ps_fma(auVar55,local_980,local_720);
        auVar253 = vminps_avx(local_740,local_760);
        auVar173 = vminps_avx(local_780,auVar238);
        auVar253 = vminps_avx(auVar253,auVar173);
        auVar107 = vsubps_avx(auVar253,auVar107);
        auVar104 = vandps_avx(auVar224,auVar104);
        local_1a0 = ZEXT1632(auVar99);
        local_1c0 = ZEXT1632(auVar6);
        auVar56._4_4_ = auVar107._4_4_ * 0.99999976;
        auVar56._0_4_ = auVar107._0_4_ * 0.99999976;
        auVar56._8_4_ = auVar107._8_4_ * 0.99999976;
        auVar56._12_4_ = auVar107._12_4_ * 0.99999976;
        auVar56._16_4_ = auVar107._16_4_ * 0.99999976;
        auVar56._20_4_ = auVar107._20_4_ * 0.99999976;
        auVar56._24_4_ = auVar107._24_4_ * 0.99999976;
        auVar56._28_4_ = 0x3f7ffffc;
        auVar224 = vmaxps_avx(ZEXT832(0) << 0x20,auVar56);
        auVar57._4_4_ = auVar224._4_4_ * auVar224._4_4_;
        auVar57._0_4_ = auVar224._0_4_ * auVar224._0_4_;
        auVar57._8_4_ = auVar224._8_4_ * auVar224._8_4_;
        auVar57._12_4_ = auVar224._12_4_ * auVar224._12_4_;
        auVar57._16_4_ = auVar224._16_4_ * auVar224._16_4_;
        auVar57._20_4_ = auVar224._20_4_ * auVar224._20_4_;
        auVar57._24_4_ = auVar224._24_4_ * auVar224._24_4_;
        auVar57._28_4_ = auVar224._28_4_;
        auVar107 = vsubps_avx(auVar15,auVar57);
        auVar58._4_4_ = auVar107._4_4_ * fVar152 * 4.0;
        auVar58._0_4_ = auVar107._0_4_ * fVar150 * 4.0;
        auVar58._8_4_ = auVar107._8_4_ * fVar151 * 4.0;
        auVar58._12_4_ = auVar107._12_4_ * fVar153 * 4.0;
        auVar58._16_4_ = auVar107._16_4_ * fVar155 * 4.0;
        auVar58._20_4_ = auVar107._20_4_ * fVar157 * 4.0;
        auVar58._24_4_ = auVar107._24_4_ * fVar243 * 4.0;
        auVar58._28_4_ = auVar224._28_4_;
        auVar253 = vsubps_avx(auVar44,auVar58);
        auVar68 = ZEXT412(0);
        auVar173 = ZEXT1232(auVar68) << 0x20;
        local_840 = ZEXT1232(auVar68) << 0x20;
        auVar224 = vcmpps_avx(auVar253,ZEXT832(0) << 0x20,5);
        if ((((((((auVar224 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar224 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar224 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar224 >> 0x7f,0) == '\0') &&
              (auVar224 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar224 >> 0xbf,0) == '\0') &&
            (auVar224 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar224[0x1f]) {
          _local_860 = ZEXT1232(auVar68) << 0x20;
          auVar193 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar210 = ZEXT1228(ZEXT812(0)) << 0x20;
          auVar228._8_4_ = 0x7f800000;
          auVar228._0_8_ = 0x7f8000007f800000;
          auVar228._12_4_ = 0x7f800000;
          auVar228._16_4_ = 0x7f800000;
          auVar228._20_4_ = 0x7f800000;
          auVar228._24_4_ = 0x7f800000;
          auVar228._28_4_ = 0x7f800000;
          auVar234._8_4_ = 0xff800000;
          auVar234._0_8_ = 0xff800000ff800000;
          auVar234._12_4_ = 0xff800000;
          auVar234._16_4_ = 0xff800000;
          auVar234._20_4_ = 0xff800000;
          auVar234._24_4_ = 0xff800000;
          auVar234._28_4_ = 0xff800000;
          _local_820 = local_840;
        }
        else {
          auVar215 = vsqrtps_avx(auVar253);
          auVar194._0_4_ = fVar150 + fVar150;
          auVar194._4_4_ = fVar152 + fVar152;
          auVar194._8_4_ = fVar151 + fVar151;
          auVar194._12_4_ = fVar153 + fVar153;
          auVar194._16_4_ = fVar155 + fVar155;
          auVar194._20_4_ = fVar157 + fVar157;
          auVar194._24_4_ = fVar243 + fVar243;
          auVar194._28_4_ = fVar126 + fVar126;
          auVar173 = vrcpps_avx(auVar194);
          auVar99 = vfnmadd213ps_fma(auVar194,auVar173,auVar274);
          auVar99 = vfmadd132ps_fma(ZEXT1632(auVar99),auVar173,auVar173);
          auVar218._0_4_ = (uint)auVar271._0_4_ ^ local_5e0;
          auVar218._4_4_ = (uint)auVar271._4_4_ ^ uStack_5dc;
          auVar218._8_4_ = (uint)auVar271._8_4_ ^ uStack_5d8;
          auVar218._12_4_ = (uint)auVar271._12_4_ ^ uStack_5d4;
          auVar218._16_4_ = (uint)auVar271._16_4_ ^ (uint)fStack_5d0;
          auVar218._20_4_ = (uint)auVar271._20_4_ ^ (uint)fStack_5cc;
          auVar218._24_4_ = (uint)auVar271._24_4_ ^ (uint)fStack_5c8;
          auVar218._28_4_ = (uint)auVar271._28_4_ ^ uStack_5c4;
          auVar173 = vsubps_avx(auVar218,auVar215);
          auVar215 = vsubps_avx(auVar215,auVar271);
          fVar180 = auVar173._0_4_ * auVar99._0_4_;
          fVar198 = auVar173._4_4_ * auVar99._4_4_;
          auVar59._4_4_ = fVar198;
          auVar59._0_4_ = fVar180;
          fVar199 = auVar173._8_4_ * auVar99._8_4_;
          auVar59._8_4_ = fVar199;
          fVar200 = auVar173._12_4_ * auVar99._12_4_;
          auVar59._12_4_ = fVar200;
          fVar201 = auVar173._16_4_ * 0.0;
          auVar59._16_4_ = fVar201;
          fVar202 = auVar173._20_4_ * 0.0;
          auVar59._20_4_ = fVar202;
          fVar203 = auVar173._24_4_ * 0.0;
          auVar59._24_4_ = fVar203;
          auVar59._28_4_ = 0x3f800000;
          fVar126 = auVar215._0_4_ * auVar99._0_4_;
          fVar150 = auVar215._4_4_ * auVar99._4_4_;
          auVar60._4_4_ = fVar150;
          auVar60._0_4_ = fVar126;
          fVar152 = auVar215._8_4_ * auVar99._8_4_;
          auVar60._8_4_ = fVar152;
          fVar151 = auVar215._12_4_ * auVar99._12_4_;
          auVar60._12_4_ = fVar151;
          fVar153 = auVar215._16_4_ * 0.0;
          auVar60._16_4_ = fVar153;
          fVar155 = auVar215._20_4_ * 0.0;
          auVar60._20_4_ = fVar155;
          fVar157 = auVar215._24_4_ * 0.0;
          auVar60._24_4_ = fVar157;
          auVar60._28_4_ = local_600._28_4_;
          auVar99 = vfmadd213ps_fma(auVar260,auVar59,auVar108);
          auVar6 = vfmadd213ps_fma(auVar260,auVar60,auVar108);
          auVar61._28_4_ = auVar173._28_4_;
          auVar61._0_28_ =
               ZEXT1628(CONCAT412(fVar154 * auVar99._12_4_,
                                  CONCAT48(fVar156 * auVar99._8_4_,
                                           CONCAT44(fVar149 * auVar99._4_4_,fVar148 * auVar99._0_4_)
                                          )));
          auVar173 = ZEXT1632(CONCAT412(fVar154 * auVar6._12_4_,
                                        CONCAT48(fVar156 * auVar6._8_4_,
                                                 CONCAT44(fVar149 * auVar6._4_4_,
                                                          fVar148 * auVar6._0_4_))));
          auVar99 = vfmadd213ps_fma(auVar16,auVar61,auVar192);
          auVar6 = vfmadd213ps_fma(auVar16,auVar173,auVar192);
          auVar94 = vfmadd213ps_fma(auVar17,auVar61,auVar105);
          auVar236 = vfmadd213ps_fma(auVar17,auVar173,auVar105);
          auVar160 = vfmadd213ps_fma(auVar61,auVar193,auVar277);
          auVar101 = vfmadd213ps_fma(auVar193,auVar173,auVar277);
          auVar62._4_4_ = fVar198 * (float)local_7c0._4_4_;
          auVar62._0_4_ = fVar180 * (float)local_7c0._0_4_;
          auVar62._8_4_ = fVar199 * fStack_7b8;
          auVar62._12_4_ = fVar200 * fStack_7b4;
          auVar62._16_4_ = fVar201 * fStack_7b0;
          auVar62._20_4_ = fVar202 * fStack_7ac;
          auVar62._24_4_ = fVar203 * fStack_7a8;
          auVar62._28_4_ = 0;
          auVar173 = vsubps_avx(auVar62,ZEXT1632(auVar99));
          auVar195._0_4_ = (float)local_9a0._0_4_ * fVar180;
          auVar195._4_4_ = (float)local_9a0._4_4_ * fVar198;
          auVar195._8_4_ = fStack_998 * fVar199;
          auVar195._12_4_ = fStack_994 * fVar200;
          auVar195._16_4_ = fStack_990 * fVar201;
          auVar195._20_4_ = fStack_98c * fVar202;
          auVar195._24_4_ = fStack_988 * fVar203;
          auVar195._28_4_ = 0;
          auVar193 = vsubps_avx(auVar195,ZEXT1632(auVar94));
          auVar229._0_4_ = fVar91 * fVar180;
          auVar229._4_4_ = fVar91 * fVar198;
          auVar229._8_4_ = fVar91 * fVar199;
          auVar229._12_4_ = fVar91 * fVar200;
          auVar229._16_4_ = fVar91 * fVar201;
          auVar229._20_4_ = fVar91 * fVar202;
          auVar229._24_4_ = fVar91 * fVar203;
          auVar229._28_4_ = 0;
          auVar16 = vsubps_avx(auVar229,ZEXT1632(auVar160));
          auVar210 = auVar16._0_28_;
          auVar63._4_4_ = fVar150 * (float)local_7c0._4_4_;
          auVar63._0_4_ = fVar126 * (float)local_7c0._0_4_;
          auVar63._8_4_ = fVar152 * fStack_7b8;
          auVar63._12_4_ = fVar151 * fStack_7b4;
          auVar63._16_4_ = fVar153 * fStack_7b0;
          auVar63._20_4_ = fVar155 * fStack_7ac;
          auVar63._24_4_ = fVar157 * fStack_7a8;
          auVar63._28_4_ = 0;
          _local_820 = vsubps_avx(auVar63,ZEXT1632(auVar6));
          auVar64._4_4_ = (float)local_9a0._4_4_ * fVar150;
          auVar64._0_4_ = (float)local_9a0._0_4_ * fVar126;
          auVar64._8_4_ = fStack_998 * fVar152;
          auVar64._12_4_ = fStack_994 * fVar151;
          auVar64._16_4_ = fStack_990 * fVar153;
          auVar64._20_4_ = fStack_98c * fVar155;
          auVar64._24_4_ = fStack_988 * fVar157;
          auVar64._28_4_ = local_820._28_4_;
          local_840 = vsubps_avx(auVar64,ZEXT1632(auVar236));
          auVar65._4_4_ = fVar91 * fVar150;
          auVar65._0_4_ = fVar91 * fVar126;
          auVar65._8_4_ = fVar91 * fVar152;
          auVar65._12_4_ = fVar91 * fVar151;
          auVar65._16_4_ = fVar91 * fVar153;
          auVar65._20_4_ = fVar91 * fVar155;
          auVar65._24_4_ = fVar91 * fVar157;
          auVar65._28_4_ = local_840._28_4_;
          _local_860 = vsubps_avx(auVar65,ZEXT1632(auVar101));
          auVar261 = ZEXT864(0) << 0x20;
          auVar16 = vcmpps_avx(auVar253,_DAT_01faff00,5);
          auVar230._8_4_ = 0x7f800000;
          auVar230._0_8_ = 0x7f8000007f800000;
          auVar230._12_4_ = 0x7f800000;
          auVar230._16_4_ = 0x7f800000;
          auVar230._20_4_ = 0x7f800000;
          auVar230._24_4_ = 0x7f800000;
          auVar230._28_4_ = 0x7f800000;
          auVar228 = vblendvps_avx(auVar230,auVar59,auVar16);
          auVar253 = vandps_avx(local_800,auVar43);
          auVar253 = vmaxps_avx(local_4c0,auVar253);
          auVar66._4_4_ = auVar253._4_4_ * 1.9073486e-06;
          auVar66._0_4_ = auVar253._0_4_ * 1.9073486e-06;
          auVar66._8_4_ = auVar253._8_4_ * 1.9073486e-06;
          auVar66._12_4_ = auVar253._12_4_ * 1.9073486e-06;
          auVar66._16_4_ = auVar253._16_4_ * 1.9073486e-06;
          auVar66._20_4_ = auVar253._20_4_ * 1.9073486e-06;
          auVar66._24_4_ = auVar253._24_4_ * 1.9073486e-06;
          auVar66._28_4_ = auVar253._28_4_;
          auVar253 = vandps_avx(local_800,local_4e0);
          auVar253 = vcmpps_avx(auVar253,auVar66,1);
          auVar235._8_4_ = 0xff800000;
          auVar235._0_8_ = 0xff800000ff800000;
          auVar235._12_4_ = 0xff800000;
          auVar235._16_4_ = 0xff800000;
          auVar235._20_4_ = 0xff800000;
          auVar235._24_4_ = 0xff800000;
          auVar235._28_4_ = 0xff800000;
          auVar234 = vblendvps_avx(auVar235,auVar60,auVar16);
          auVar17 = auVar16 & auVar253;
          if ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar17 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar17 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar17 >> 0x7f,0) != '\0') ||
                (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar17 >> 0xbf,0) != '\0') ||
              (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar17[0x1f] < '\0') {
            auVar224 = vandps_avx(auVar253,auVar16);
            auVar253 = vcmpps_avx(auVar107,ZEXT832(0) << 0x20,2);
            auVar267._8_4_ = 0xff800000;
            auVar267._0_8_ = 0xff800000ff800000;
            auVar267._12_4_ = 0xff800000;
            auVar267._16_4_ = 0xff800000;
            auVar267._20_4_ = 0xff800000;
            auVar267._24_4_ = 0xff800000;
            auVar267._28_4_ = 0xff800000;
            auVar272._8_4_ = 0x7f800000;
            auVar272._0_8_ = 0x7f8000007f800000;
            auVar272._12_4_ = 0x7f800000;
            auVar272._16_4_ = 0x7f800000;
            auVar272._20_4_ = 0x7f800000;
            auVar272._24_4_ = 0x7f800000;
            auVar272._28_4_ = 0x7f800000;
            auVar107 = vblendvps_avx(auVar272,auVar267,auVar253);
            auVar99 = vpackssdw_avx(auVar224._0_16_,auVar224._16_16_);
            auVar17 = vpmovsxwd_avx2(auVar99);
            auVar228 = vblendvps_avx(auVar228,auVar107,auVar17);
            auVar107 = vblendvps_avx(auVar267,auVar272,auVar253);
            auVar261 = ZEXT3264(auVar107);
            auVar234 = vblendvps_avx(auVar234,auVar107,auVar17);
            auVar247._0_8_ = auVar224._0_8_ ^ 0xffffffffffffffff;
            auVar247._8_4_ = auVar224._8_4_ ^ 0xffffffff;
            auVar247._12_4_ = auVar224._12_4_ ^ 0xffffffff;
            auVar247._16_4_ = auVar224._16_4_ ^ 0xffffffff;
            auVar247._20_4_ = auVar224._20_4_ ^ 0xffffffff;
            auVar247._24_4_ = auVar224._24_4_ ^ 0xffffffff;
            auVar247._28_4_ = auVar224._28_4_ ^ 0xffffffff;
            auVar224 = vorps_avx(auVar253,auVar247);
            auVar224 = vandps_avx(auVar224,auVar16);
          }
        }
        auVar279 = ZEXT3264(auVar269);
        auVar249 = ZEXT3264(_local_7e0);
        local_420 = _local_7e0;
        local_400 = vminps_avx(local_3c0,auVar228);
        _local_620 = vmaxps_avx(_local_7e0,auVar234);
        local_3e0 = _local_620;
        auVar107 = vcmpps_avx(_local_7e0,local_400,2);
        local_540 = vandps_avx(auVar107,auVar104);
        auVar107 = vcmpps_avx(_local_620,local_3c0,2);
        local_580 = vandps_avx(auVar107,auVar104);
        auVar104 = vorps_avx(local_580,local_540);
        if ((((((((auVar104 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar104 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar104 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar104 >> 0x7f,0) != '\0') ||
              (auVar104 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar104 >> 0xbf,0) != '\0') ||
            (auVar104 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar104[0x1f] < '\0') {
          local_5a0._0_8_ = auVar224._0_8_ ^ 0xffffffffffffffff;
          local_5a0._8_4_ = auVar224._8_4_ ^ 0xffffffff;
          local_5a0._12_4_ = auVar224._12_4_ ^ 0xffffffff;
          local_5a0._16_4_ = auVar224._16_4_ ^ 0xffffffff;
          local_5a0._20_4_ = auVar224._20_4_ ^ 0xffffffff;
          local_5a0._24_4_ = auVar224._24_4_ ^ 0xffffffff;
          local_5a0._28_4_ = auVar224._28_4_ ^ 0xffffffff;
          auVar67._4_4_ = fVar91 * auVar210._4_4_;
          auVar67._0_4_ = fVar91 * auVar210._0_4_;
          auVar67._8_4_ = fVar91 * auVar210._8_4_;
          auVar67._12_4_ = fVar91 * auVar210._12_4_;
          auVar67._16_4_ = fVar91 * auVar210._16_4_;
          auVar67._20_4_ = fVar91 * auVar210._20_4_;
          auVar67._24_4_ = fVar91 * auVar210._24_4_;
          auVar67._28_4_ = auVar104._28_4_;
          auVar99 = vfmadd213ps_fma(auVar193,_local_9a0,auVar67);
          auVar99 = vfmadd213ps_fma(auVar173,_local_7c0,ZEXT1632(auVar99));
          auVar104 = vandps_avx(ZEXT1632(auVar99),local_800);
          auVar144._8_4_ = 0x3e99999a;
          auVar144._0_8_ = 0x3e99999a3e99999a;
          auVar144._12_4_ = 0x3e99999a;
          auVar144._16_4_ = 0x3e99999a;
          auVar144._20_4_ = 0x3e99999a;
          auVar144._24_4_ = 0x3e99999a;
          auVar144._28_4_ = 0x3e99999a;
          auVar104 = vcmpps_avx(auVar104,auVar144,1);
          auVar104 = vorps_avx(auVar104,local_5a0);
          auVar145._8_4_ = 3;
          auVar145._0_8_ = 0x300000003;
          auVar145._12_4_ = 3;
          auVar145._16_4_ = 3;
          auVar145._20_4_ = 3;
          auVar145._24_4_ = 3;
          auVar145._28_4_ = 3;
          auVar174._8_4_ = 2;
          auVar174._0_8_ = 0x200000002;
          auVar174._12_4_ = 2;
          auVar174._16_4_ = 2;
          auVar174._20_4_ = 2;
          auVar174._24_4_ = 2;
          auVar174._28_4_ = 2;
          auVar104 = vblendvps_avx(auVar174,auVar145,auVar104);
          local_5c0._4_4_ = local_bac;
          local_5c0._0_4_ = local_bac;
          local_5c0._8_4_ = local_bac;
          local_5c0._12_4_ = local_bac;
          local_5c0._16_4_ = local_bac;
          local_5c0._20_4_ = local_bac;
          local_5c0._24_4_ = local_bac;
          local_5c0._28_4_ = local_bac;
          local_560 = vpcmpgtd_avx2(auVar104,local_5c0);
          local_520 = vpandn_avx2(local_560,local_540);
          auVar146 = ZEXT3264(local_520);
          auVar104 = local_540 & ~local_560;
          fStack_abc = auVar2._4_4_;
          fStack_ab8 = auVar2._8_4_;
          fStack_ab4 = auVar2._12_4_;
          if ((((((((auVar104 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar104 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar104 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar104 >> 0x7f,0) == '\0') &&
                (auVar104 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar104 >> 0xbf,0) == '\0') &&
              (auVar104 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar104[0x1f]) {
            auVar117._4_4_ = fVar250;
            auVar117._0_4_ = fVar250;
            auVar117._8_4_ = fVar250;
            auVar117._12_4_ = fVar250;
            auVar117._16_4_ = fVar250;
            auVar117._20_4_ = fVar250;
            auVar117._24_4_ = fVar250;
            auVar117._28_4_ = fVar250;
          }
          else {
            auVar6 = vminps_avx(auVar3,auVar5);
            auVar99 = vmaxps_avx(auVar3,auVar5);
            auVar94 = vminps_avx(auVar4,auVar2);
            auVar236 = vminps_avx(auVar6,auVar94);
            auVar6 = vmaxps_avx(auVar4,auVar2);
            auVar94 = vmaxps_avx(auVar99,auVar6);
            local_900._8_4_ = 0x7fffffff;
            local_900._0_8_ = 0x7fffffff7fffffff;
            local_900._12_4_ = 0x7fffffff;
            auVar99 = vandps_avx(auVar236,local_900);
            auVar6 = vandps_avx(auVar94,local_900);
            auVar99 = vmaxps_avx(auVar99,auVar6);
            auVar6 = vmovshdup_avx(auVar99);
            auVar6 = vmaxss_avx(auVar6,auVar99);
            auVar99 = vshufpd_avx(auVar99,auVar99,1);
            auVar99 = vmaxss_avx(auVar99,auVar6);
            fVar126 = auVar99._0_4_ * 1.9073486e-06;
            local_7a0 = vshufps_avx(auVar94,auVar94,0xff);
            local_b40._4_4_ = (float)local_7e0._4_4_ + (float)local_920._4_4_;
            local_b40._0_4_ = (float)local_7e0._0_4_ + (float)local_920._0_4_;
            fStack_b38 = fStack_7d8 + fStack_918;
            fStack_b34 = fStack_7d4 + fStack_914;
            fStack_b30 = fStack_7d0 + fStack_910;
            fStack_b2c = fStack_7cc + fStack_90c;
            fStack_b28 = fStack_7c8 + fStack_908;
            fStack_b24 = fStack_7c4 + fStack_904;
            do {
              auVar118._8_4_ = 0x7f800000;
              auVar118._0_8_ = 0x7f8000007f800000;
              auVar118._12_4_ = 0x7f800000;
              auVar118._16_4_ = 0x7f800000;
              auVar118._20_4_ = 0x7f800000;
              auVar118._24_4_ = 0x7f800000;
              auVar118._28_4_ = 0x7f800000;
              auVar104 = auVar146._0_32_;
              auVar224 = vblendvps_avx(auVar118,_local_7e0,auVar104);
              auVar107 = vshufps_avx(auVar224,auVar224,0xb1);
              auVar107 = vminps_avx(auVar224,auVar107);
              auVar253 = vshufpd_avx(auVar107,auVar107,5);
              auVar107 = vminps_avx(auVar107,auVar253);
              auVar253 = vpermpd_avx2(auVar107,0x4e);
              auVar107 = vminps_avx(auVar107,auVar253);
              auVar224 = vcmpps_avx(auVar224,auVar107,0);
              auVar107 = auVar104 & auVar224;
              if ((((((((auVar107 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar107 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar107 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar107 >> 0x7f,0) != '\0') ||
                    (auVar107 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar107 >> 0xbf,0) != '\0') ||
                  (auVar107 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar107[0x1f] < '\0') {
                auVar104 = vandps_avx(auVar224,auVar104);
              }
              uVar81 = vmovmskps_avx(auVar104);
              iVar18 = 0;
              for (; (uVar81 & 1) == 0; uVar81 = uVar81 >> 1 | 0x80000000) {
                iVar18 = iVar18 + 1;
              }
              uVar82 = iVar18 << 2;
              *(undefined4 *)(local_520 + uVar82) = 0;
              uVar81 = *(uint *)(local_1a0 + uVar82);
              uVar82 = *(uint *)(local_420 + uVar82);
              fVar148 = auVar10._0_4_;
              if ((float)local_940._0_4_ < 0.0) {
                fVar148 = sqrtf((float)local_940._0_4_);
              }
              local_720._0_4_ = fVar148 * 1.9073486e-06;
              auVar99 = vinsertps_avx(ZEXT416(uVar82),ZEXT416(uVar81),0x10);
              bVar89 = true;
              uVar85 = 0;
              do {
                auVar94 = vmovshdup_avx(auVar99);
                fVar152 = 1.0 - auVar94._0_4_;
                auVar6 = vshufps_avx(auVar99,auVar99,0x55);
                fVar148 = auVar6._0_4_;
                auVar127._0_4_ = fVar125 * fVar148;
                fVar149 = auVar6._4_4_;
                auVar127._4_4_ = auVar5._4_4_ * fVar149;
                fVar150 = auVar6._8_4_;
                auVar127._8_4_ = auVar5._8_4_ * fVar150;
                fVar156 = auVar6._12_4_;
                auVar127._12_4_ = auVar5._12_4_ * fVar156;
                auVar159._4_4_ = fVar152;
                auVar159._0_4_ = fVar152;
                auVar159._8_4_ = fVar152;
                auVar159._12_4_ = fVar152;
                auVar6 = vfmadd231ps_fma(auVar127,auVar159,auVar3);
                auVar181._0_4_ = fVar158 * fVar148;
                auVar181._4_4_ = auVar4._4_4_ * fVar149;
                auVar181._8_4_ = auVar4._8_4_ * fVar150;
                auVar181._12_4_ = auVar4._12_4_ * fVar156;
                auVar236 = vfmadd231ps_fma(auVar181,auVar159,auVar5);
                auVar219._0_4_ = fVar148 * auVar236._0_4_;
                auVar219._4_4_ = fVar149 * auVar236._4_4_;
                auVar219._8_4_ = fVar150 * auVar236._8_4_;
                auVar219._12_4_ = fVar156 * auVar236._12_4_;
                auVar160 = vfmadd231ps_fma(auVar219,auVar159,auVar6);
                auVar128._0_4_ = fVar148 * fVar179;
                auVar128._4_4_ = fVar149 * fStack_abc;
                auVar128._8_4_ = fVar150 * fStack_ab8;
                auVar128._12_4_ = fVar156 * fStack_ab4;
                auVar6 = vfmadd231ps_fma(auVar128,auVar159,auVar4);
                auVar204._0_4_ = fVar148 * auVar6._0_4_;
                auVar204._4_4_ = fVar149 * auVar6._4_4_;
                auVar204._8_4_ = fVar150 * auVar6._8_4_;
                auVar204._12_4_ = fVar156 * auVar6._12_4_;
                auVar236 = vfmadd231ps_fma(auVar204,auVar159,auVar236);
                fVar154 = auVar99._0_4_;
                auVar129._4_4_ = fVar154;
                auVar129._0_4_ = fVar154;
                auVar129._8_4_ = fVar154;
                auVar129._12_4_ = fVar154;
                auVar6 = vfmadd213ps_fma(auVar129,local_930,_DAT_01f7aa10);
                auVar96._0_4_ = fVar148 * auVar236._0_4_;
                auVar96._4_4_ = fVar149 * auVar236._4_4_;
                auVar96._8_4_ = fVar150 * auVar236._8_4_;
                auVar96._12_4_ = fVar156 * auVar236._12_4_;
                auVar101 = vfmadd231ps_fma(auVar96,auVar160,auVar159);
                local_700._0_16_ = auVar101;
                auVar6 = vsubps_avx(auVar6,auVar101);
                _local_8e0 = auVar6;
                auVar6 = vdpps_avx(auVar6,auVar6,0x7f);
                fVar148 = auVar6._0_4_;
                if (fVar148 < 0.0) {
                  auVar122._0_4_ = sqrtf(fVar148);
                  auVar122._4_60_ = extraout_var;
                  auVar101 = auVar122._0_16_;
                }
                else {
                  auVar101 = vsqrtss_avx(auVar6,auVar6);
                }
                auVar236 = vsubps_avx(auVar236,auVar160);
                auVar231._0_4_ = auVar236._0_4_ * 3.0;
                auVar231._4_4_ = auVar236._4_4_ * 3.0;
                auVar231._8_4_ = auVar236._8_4_ * 3.0;
                auVar231._12_4_ = auVar236._12_4_ * 3.0;
                auVar236 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),ZEXT416((uint)fVar152),
                                           auVar94);
                auVar160 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar94,
                                           ZEXT416((uint)fVar152));
                fVar152 = fVar152 * 6.0;
                fVar149 = auVar236._0_4_ * 6.0;
                fVar150 = auVar160._0_4_ * 6.0;
                fVar156 = auVar94._0_4_ * 6.0;
                auVar182._0_4_ = fVar156 * fVar179;
                auVar182._4_4_ = fVar156 * fStack_abc;
                auVar182._8_4_ = fVar156 * fStack_ab8;
                auVar182._12_4_ = fVar156 * fStack_ab4;
                auVar130._4_4_ = fVar150;
                auVar130._0_4_ = fVar150;
                auVar130._8_4_ = fVar150;
                auVar130._12_4_ = fVar150;
                auVar94 = vfmadd132ps_fma(auVar130,auVar182,auVar4);
                auVar183._4_4_ = fVar149;
                auVar183._0_4_ = fVar149;
                auVar183._8_4_ = fVar149;
                auVar183._12_4_ = fVar149;
                auVar94 = vfmadd132ps_fma(auVar183,auVar94,auVar5);
                auVar236 = vdpps_avx(auVar231,auVar231,0x7f);
                auVar131._4_4_ = fVar152;
                auVar131._0_4_ = fVar152;
                auVar131._8_4_ = fVar152;
                auVar131._12_4_ = fVar152;
                auVar233 = vfmadd132ps_fma(auVar131,auVar94,auVar3);
                auVar94 = vblendps_avx(auVar236,_DAT_01f7aa10,0xe);
                auVar160 = vrsqrtss_avx(auVar94,auVar94);
                fVar156 = auVar236._0_4_;
                fVar149 = auVar160._0_4_;
                auVar160 = vdpps_avx(auVar231,auVar233,0x7f);
                fVar149 = fVar149 * 1.5 + fVar156 * -0.5 * fVar149 * fVar149 * fVar149;
                auVar132._0_4_ = auVar233._0_4_ * fVar156;
                auVar132._4_4_ = auVar233._4_4_ * fVar156;
                auVar132._8_4_ = auVar233._8_4_ * fVar156;
                auVar132._12_4_ = auVar233._12_4_ * fVar156;
                fVar150 = auVar160._0_4_;
                auVar220._0_4_ = auVar231._0_4_ * fVar150;
                auVar220._4_4_ = auVar231._4_4_ * fVar150;
                auVar220._8_4_ = auVar231._8_4_ * fVar150;
                auVar220._12_4_ = auVar231._12_4_ * fVar150;
                auVar160 = vsubps_avx(auVar132,auVar220);
                auVar94 = vrcpss_avx(auVar94,auVar94);
                auVar233 = vfnmadd213ss_fma(auVar94,auVar236,ZEXT416(0x40000000));
                fVar150 = auVar94._0_4_ * auVar233._0_4_;
                auVar94 = vmaxss_avx(ZEXT416((uint)fVar126),
                                     ZEXT416((uint)(fVar154 * (float)local_720._0_4_)));
                uVar84 = CONCAT44(auVar231._4_4_,auVar231._0_4_);
                auVar244._0_8_ = uVar84 ^ 0x8000000080000000;
                auVar244._8_4_ = -auVar231._8_4_;
                auVar244._12_4_ = -auVar231._12_4_;
                auVar184._0_4_ = fVar149 * auVar160._0_4_ * fVar150;
                auVar184._4_4_ = fVar149 * auVar160._4_4_ * fVar150;
                auVar184._8_4_ = fVar149 * auVar160._8_4_ * fVar150;
                auVar184._12_4_ = fVar149 * auVar160._12_4_ * fVar150;
                local_960._0_4_ = auVar231._0_4_ * fVar149;
                local_960._4_4_ = auVar231._4_4_ * fVar149;
                local_960._8_4_ = auVar231._8_4_ * fVar149;
                local_960._12_4_ = auVar231._12_4_ * fVar149;
                uVar81 = auVar94._0_4_;
                if (fVar156 < -fVar156) {
                  local_980._0_16_ = auVar184;
                  fVar149 = sqrtf(fVar156);
                  auVar101 = ZEXT416(auVar101._0_4_);
                  auVar94 = ZEXT416(uVar81);
                  auVar184 = local_980._0_16_;
                }
                else {
                  auVar236 = vsqrtss_avx(auVar236,auVar236);
                  fVar149 = auVar236._0_4_;
                }
                auVar236 = vdpps_avx(_local_8e0,local_960._0_16_,0x7f);
                auVar166 = vfmadd213ss_fma(ZEXT416((uint)fVar126),auVar101,auVar94);
                auVar160 = vdpps_avx(auVar244,local_960._0_16_,0x7f);
                auVar233 = vdpps_avx(_local_8e0,auVar184,0x7f);
                auVar268 = vdpps_avx(local_930,local_960._0_16_,0x7f);
                auVar127 = vfmadd213ss_fma(ZEXT416((uint)(auVar101._0_4_ + 1.0)),
                                           ZEXT416((uint)(fVar126 / fVar149)),auVar166);
                auVar97._0_4_ = auVar236._0_4_ * auVar236._0_4_;
                auVar97._4_4_ = auVar236._4_4_ * auVar236._4_4_;
                auVar97._8_4_ = auVar236._8_4_ * auVar236._8_4_;
                auVar97._12_4_ = auVar236._12_4_ * auVar236._12_4_;
                auVar101 = vdpps_avx(_local_8e0,auVar244,0x7f);
                auVar96 = vsubps_avx(auVar6,auVar97);
                auVar166 = vrsqrtss_avx(auVar96,auVar96);
                fVar150 = auVar96._0_4_;
                fVar149 = auVar166._0_4_;
                fVar149 = fVar149 * 1.5 + fVar150 * -0.5 * fVar149 * fVar149 * fVar149;
                auVar166 = vdpps_avx(_local_8e0,local_930,0x7f);
                auVar233 = ZEXT416((uint)(auVar160._0_4_ + auVar233._0_4_));
                local_960._0_16_ = vfnmadd231ss_fma(auVar101,auVar236,auVar233);
                auVar160 = vfnmadd231ss_fma(auVar166,auVar236,auVar268);
                if (fVar150 < 0.0) {
                  local_980._0_16_ = auVar236;
                  local_740._0_16_ = auVar268;
                  local_760._0_4_ = fVar149;
                  local_780._0_16_ = auVar160;
                  fVar150 = sqrtf(fVar150);
                  auVar94 = ZEXT416(uVar81);
                  fVar149 = (float)local_760._0_4_;
                  auVar160 = local_780._0_16_;
                  auVar236 = local_980._0_16_;
                  auVar268 = local_740._0_16_;
                }
                else {
                  auVar101 = vsqrtss_avx(auVar96,auVar96);
                  fVar150 = auVar101._0_4_;
                }
                auVar261 = ZEXT1664(auVar6);
                auVar249 = ZEXT1664(auVar231);
                auVar101 = vpermilps_avx(local_700._0_16_,0xff);
                fVar150 = fVar150 - auVar101._0_4_;
                auVar166 = vshufps_avx(auVar231,auVar231,0xff);
                auVar101 = vfmsub213ss_fma(local_960._0_16_,ZEXT416((uint)fVar149),auVar166);
                auVar185._0_8_ = auVar268._0_8_ ^ 0x8000000080000000;
                auVar185._8_4_ = auVar268._8_4_ ^ 0x80000000;
                auVar185._12_4_ = auVar268._12_4_ ^ 0x80000000;
                auVar205._0_8_ = auVar101._0_8_ ^ 0x8000000080000000;
                auVar205._8_4_ = auVar101._8_4_ ^ 0x80000000;
                auVar205._12_4_ = auVar101._12_4_ ^ 0x80000000;
                auVar160 = ZEXT416((uint)(auVar160._0_4_ * fVar149));
                auVar101 = vfmsub231ss_fma(ZEXT416((uint)(auVar268._0_4_ * auVar101._0_4_)),auVar233
                                           ,auVar160);
                auVar160 = vinsertps_avx(auVar205,auVar160,0x1c);
                uVar92 = auVar101._0_4_;
                auVar206._4_4_ = uVar92;
                auVar206._0_4_ = uVar92;
                auVar206._8_4_ = uVar92;
                auVar206._12_4_ = uVar92;
                auVar160 = vdivps_avx(auVar160,auVar206);
                auVar101 = vinsertps_avx(auVar233,auVar185,0x10);
                auVar101 = vdivps_avx(auVar101,auVar206);
                fVar149 = auVar236._0_4_;
                auVar161._0_4_ = fVar149 * auVar160._0_4_ + fVar150 * auVar101._0_4_;
                auVar161._4_4_ = fVar149 * auVar160._4_4_ + fVar150 * auVar101._4_4_;
                auVar161._8_4_ = fVar149 * auVar160._8_4_ + fVar150 * auVar101._8_4_;
                auVar161._12_4_ = fVar149 * auVar160._12_4_ + fVar150 * auVar101._12_4_;
                auVar99 = vsubps_avx(auVar99,auVar161);
                auVar236 = vandps_avx(auVar236,local_900);
                if (auVar236._0_4_ < auVar127._0_4_) {
                  auVar236 = vfmadd231ss_fma(ZEXT416((uint)(auVar94._0_4_ + auVar127._0_4_)),
                                             local_7a0,ZEXT416(0x36000000));
                  auVar94 = vandps_avx(ZEXT416((uint)fVar150),local_900);
                  if (auVar94._0_4_ < auVar236._0_4_) {
                    fVar149 = auVar99._0_4_ + (float)local_8a0._0_4_;
                    if (fVar149 < fVar124) {
                      bVar90 = 0;
                    }
                    else {
                      fVar150 = *(float *)(ray + k * 4 + 0x80);
                      if (fVar150 < fVar149) {
                        bVar90 = 0;
                      }
                      else {
                        auVar94 = vmovshdup_avx(auVar99);
                        bVar90 = 0;
                        if ((0.0 <= auVar94._0_4_) && (auVar94._0_4_ <= 1.0)) {
                          auVar94 = vrsqrtss_avx(auVar6,auVar6);
                          fVar156 = auVar94._0_4_;
                          pGVar8 = (context->scene->geometries).items[uVar83].ptr;
                          if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                            bVar90 = 0;
                          }
                          else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                  (bVar90 = 1, pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0))
                          {
                            fVar148 = fVar156 * 1.5 + fVar148 * -0.5 * fVar156 * fVar156 * fVar156;
                            auVar162._0_4_ = fVar148 * (float)local_8e0._0_4_;
                            auVar162._4_4_ = fVar148 * (float)local_8e0._4_4_;
                            auVar162._8_4_ = fVar148 * fStack_8d8;
                            auVar162._12_4_ = fVar148 * fStack_8d4;
                            auVar101 = vfmadd213ps_fma(auVar166,auVar162,auVar231);
                            auVar94 = vshufps_avx(auVar162,auVar162,0xc9);
                            auVar236 = vshufps_avx(auVar231,auVar231,0xc9);
                            auVar163._0_4_ = auVar162._0_4_ * auVar236._0_4_;
                            auVar163._4_4_ = auVar162._4_4_ * auVar236._4_4_;
                            auVar163._8_4_ = auVar162._8_4_ * auVar236._8_4_;
                            auVar163._12_4_ = auVar162._12_4_ * auVar236._12_4_;
                            auVar160 = vfmsub231ps_fma(auVar163,auVar231,auVar94);
                            auVar94 = vshufps_avx(auVar160,auVar160,0xc9);
                            auVar236 = vshufps_avx(auVar101,auVar101,0xc9);
                            auVar160 = vshufps_avx(auVar160,auVar160,0xd2);
                            auVar98._0_4_ = auVar101._0_4_ * auVar160._0_4_;
                            auVar98._4_4_ = auVar101._4_4_ * auVar160._4_4_;
                            auVar98._8_4_ = auVar101._8_4_ * auVar160._8_4_;
                            auVar98._12_4_ = auVar101._12_4_ * auVar160._12_4_;
                            auVar94 = vfmsub231ps_fma(auVar98,auVar94,auVar236);
                            local_690 = vshufps_avx(auVar99,auVar99,0x55);
                            local_6c0 = (RTCHitN  [16])vshufps_avx(auVar94,auVar94,0x55);
                            auStack_6b0 = vshufps_avx(auVar94,auVar94,0xaa);
                            local_6a0 = auVar94._0_4_;
                            local_680 = ZEXT416(0) << 0x20;
                            local_670 = CONCAT44(uStack_6dc,local_6e0);
                            uStack_668 = CONCAT44(uStack_6d4,uStack_6d8);
                            local_660._4_4_ = uStack_6cc;
                            local_660._0_4_ = local_6d0;
                            local_660._8_4_ = uStack_6c8;
                            local_660._12_4_ = uStack_6c4;
                            vpcmpeqd_avx2(ZEXT1632(local_660),ZEXT1632(local_660));
                            uStack_64c = context->user->instID[0];
                            local_650 = uStack_64c;
                            uStack_648 = uStack_64c;
                            uStack_644 = uStack_64c;
                            uStack_640 = context->user->instPrimID[0];
                            uStack_63c = uStack_640;
                            uStack_638 = uStack_640;
                            uStack_634 = uStack_640;
                            *(float *)(ray + k * 4 + 0x80) = fVar149;
                            auVar99 = *(undefined1 (*) [16])
                                       (mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
                            local_8c0._0_16_ = auVar99;
                            local_9d0.valid = (int *)local_8c0;
                            local_9d0.geometryUserPtr = pGVar8->userPtr;
                            local_9d0.context = context->user;
                            local_9d0.hit = local_6c0;
                            local_9d0.N = 4;
                            local_9d0.ray = (RTCRayN *)ray;
                            uStack_69c = local_6a0;
                            uStack_698 = local_6a0;
                            uStack_694 = local_6a0;
                            if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                              auVar249 = ZEXT1664(auVar231);
                              auVar261 = ZEXT1664(auVar6);
                              (*pGVar8->occlusionFilterN)(&local_9d0);
                              auVar99 = local_8c0._0_16_;
                            }
                            if (auVar99 == (undefined1  [16])0x0) {
                              auVar99 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                              auVar99 = auVar99 ^ _DAT_01f7ae20;
                            }
                            else {
                              p_Var9 = context->args->filter;
                              if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                                auVar249 = ZEXT1664(auVar249._0_16_);
                                auVar261 = ZEXT1664(auVar261._0_16_);
                                (*p_Var9)(&local_9d0);
                                auVar99 = local_8c0._0_16_;
                              }
                              auVar6 = vpcmpeqd_avx(auVar99,_DAT_01f7aa10);
                              auVar99 = auVar6 ^ _DAT_01f7ae20;
                              auVar164._8_4_ = 0xff800000;
                              auVar164._0_8_ = 0xff800000ff800000;
                              auVar164._12_4_ = 0xff800000;
                              auVar6 = vblendvps_avx(auVar164,*(undefined1 (*) [16])
                                                               (local_9d0.ray + 0x80),auVar6);
                              *(undefined1 (*) [16])(local_9d0.ray + 0x80) = auVar6;
                            }
                            auVar133._8_8_ = 0x100000001;
                            auVar133._0_8_ = 0x100000001;
                            bVar90 = (auVar133 & auVar99) != (undefined1  [16])0x0;
                            if (!(bool)bVar90) {
                              *(float *)(ray + k * 4 + 0x80) = fVar150;
                            }
                          }
                        }
                      }
                    }
                    goto LAB_01765dbd;
                  }
                }
                bVar89 = uVar85 < 4;
                uVar85 = uVar85 + 1;
              } while (uVar85 != 5);
              bVar89 = false;
              bVar90 = 5;
LAB_01765dbd:
              bVar86 = (bool)(bVar86 | bVar89 & bVar90);
              uVar92 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar117._4_4_ = uVar92;
              auVar117._0_4_ = uVar92;
              auVar117._8_4_ = uVar92;
              auVar117._12_4_ = uVar92;
              auVar117._16_4_ = uVar92;
              auVar117._20_4_ = uVar92;
              auVar117._24_4_ = uVar92;
              auVar117._28_4_ = uVar92;
              auVar224 = vcmpps_avx(_local_b40,auVar117,2);
              auVar104 = vandps_avx(auVar224,local_520);
              auVar146 = ZEXT3264(auVar104);
              auVar224 = local_520 & auVar224;
              local_520 = auVar104;
            } while ((((((((auVar224 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar224 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar224 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar224 >> 0x7f,0) != '\0') ||
                       (auVar224 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar224 >> 0xbf,0) != '\0') ||
                     (auVar224 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar224[0x1f] < '\0');
            auVar146 = ZEXT3264(local_3e0);
          }
          auVar107 = local_3e0;
          auVar279 = ZEXT3264(auVar269);
          auVar147._0_4_ = fVar91 * (float)local_860._0_4_;
          auVar147._4_4_ = fVar91 * (float)local_860._4_4_;
          auVar147._8_4_ = fVar91 * fStack_858;
          auVar147._12_4_ = fVar91 * fStack_854;
          auVar147._16_4_ = fVar91 * fStack_850;
          auVar147._20_4_ = fVar91 * fStack_84c;
          auVar147._28_36_ = auVar146._28_36_;
          auVar147._24_4_ = fVar91 * fStack_848;
          auVar99 = vfmadd213ps_fma(local_840,_local_9a0,auVar147._0_32_);
          auVar99 = vfmadd213ps_fma(_local_820,_local_7c0,ZEXT1632(auVar99));
          auVar104 = vandps_avx(ZEXT1632(auVar99),local_800);
          auVar175._8_4_ = 0x3e99999a;
          auVar175._0_8_ = 0x3e99999a3e99999a;
          auVar175._12_4_ = 0x3e99999a;
          auVar175._16_4_ = 0x3e99999a;
          auVar175._20_4_ = 0x3e99999a;
          auVar175._24_4_ = 0x3e99999a;
          auVar175._28_4_ = 0x3e99999a;
          auVar104 = vcmpps_avx(auVar104,auVar175,1);
          auVar224 = vorps_avx(auVar104,local_5a0);
          auVar176._0_4_ = (float)local_620._0_4_ + (float)local_920._0_4_;
          auVar176._4_4_ = (float)local_620._4_4_ + (float)local_920._4_4_;
          auVar176._8_4_ = fStack_618 + fStack_918;
          auVar176._12_4_ = fStack_614 + fStack_914;
          auVar176._16_4_ = fStack_610 + fStack_910;
          auVar176._20_4_ = fStack_60c + fStack_90c;
          auVar176._24_4_ = fStack_608 + fStack_908;
          auVar176._28_4_ = fStack_604 + fStack_904;
          auVar104 = vcmpps_avx(auVar176,auVar117,2);
          local_840 = vandps_avx(auVar104,local_580);
          auVar177._8_4_ = 3;
          auVar177._0_8_ = 0x300000003;
          auVar177._12_4_ = 3;
          auVar177._16_4_ = 3;
          auVar177._20_4_ = 3;
          auVar177._24_4_ = 3;
          auVar177._28_4_ = 3;
          auVar196._8_4_ = 2;
          auVar196._0_8_ = 0x200000002;
          auVar196._12_4_ = 2;
          auVar196._16_4_ = 2;
          auVar196._20_4_ = 2;
          auVar196._24_4_ = 2;
          auVar196._28_4_ = 2;
          auVar104 = vblendvps_avx(auVar196,auVar177,auVar224);
          _local_860 = vpcmpgtd_avx2(auVar104,local_5c0);
          auVar104 = vpandn_avx2(_local_860,local_840);
          auVar224 = local_840 & ~_local_860;
          local_8c0 = auVar104;
          if ((((((((auVar224 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar224 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar224 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar224 >> 0x7f,0) != '\0') ||
                (auVar224 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar224 >> 0xbf,0) != '\0') ||
              (auVar224 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar224[0x1f] < '\0') {
            auVar6 = vminps_avx(auVar3,auVar5);
            auVar99 = vmaxps_avx(auVar3,auVar5);
            auVar94 = vminps_avx(auVar4,auVar2);
            auVar236 = vminps_avx(auVar6,auVar94);
            auVar6 = vmaxps_avx(auVar4,auVar2);
            auVar94 = vmaxps_avx(auVar99,auVar6);
            local_900._8_4_ = 0x7fffffff;
            local_900._0_8_ = 0x7fffffff7fffffff;
            local_900._12_4_ = 0x7fffffff;
            auVar99 = vandps_avx(auVar236,local_900);
            auVar6 = vandps_avx(auVar94,local_900);
            auVar99 = vmaxps_avx(auVar99,auVar6);
            auVar6 = vmovshdup_avx(auVar99);
            auVar6 = vmaxss_avx(auVar6,auVar99);
            auVar99 = vshufpd_avx(auVar99,auVar99,1);
            auVar99 = vmaxss_avx(auVar99,auVar6);
            fVar126 = auVar99._0_4_ * 1.9073486e-06;
            local_7a0 = vshufps_avx(auVar94,auVar94,0xff);
            local_820._4_4_ = (float)local_920._4_4_ + local_3e0._4_4_;
            local_820._0_4_ = (float)local_920._0_4_ + local_3e0._0_4_;
            fStack_818 = fStack_918 + local_3e0._8_4_;
            fStack_814 = fStack_914 + local_3e0._12_4_;
            fStack_810 = fStack_910 + local_3e0._16_4_;
            fStack_80c = fStack_90c + local_3e0._20_4_;
            fStack_808 = fStack_908 + local_3e0._24_4_;
            fStack_804 = fStack_904 + local_3e0._28_4_;
            do {
              auVar119._8_4_ = 0x7f800000;
              auVar119._0_8_ = 0x7f8000007f800000;
              auVar119._12_4_ = 0x7f800000;
              auVar119._16_4_ = 0x7f800000;
              auVar119._20_4_ = 0x7f800000;
              auVar119._24_4_ = 0x7f800000;
              auVar119._28_4_ = 0x7f800000;
              auVar224 = vblendvps_avx(auVar119,auVar107,auVar104);
              auVar253 = vshufps_avx(auVar224,auVar224,0xb1);
              auVar253 = vminps_avx(auVar224,auVar253);
              auVar16 = vshufpd_avx(auVar253,auVar253,5);
              auVar253 = vminps_avx(auVar253,auVar16);
              auVar16 = vpermpd_avx2(auVar253,0x4e);
              auVar253 = vminps_avx(auVar253,auVar16);
              auVar253 = vcmpps_avx(auVar224,auVar253,0);
              auVar16 = auVar104 & auVar253;
              auVar224 = auVar104;
              if ((((((((auVar16 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar16 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar16 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar16 >> 0x7f,0) != '\0') ||
                    (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar16 >> 0xbf,0) != '\0') ||
                  (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar16[0x1f] < '\0') {
                auVar224 = vandps_avx(auVar253,auVar104);
              }
              uVar81 = vmovmskps_avx(auVar224);
              iVar18 = 0;
              for (; (uVar81 & 1) == 0; uVar81 = uVar81 >> 1 | 0x80000000) {
                iVar18 = iVar18 + 1;
              }
              uVar82 = iVar18 << 2;
              local_8c0 = auVar104;
              *(undefined4 *)(local_8c0 + uVar82) = 0;
              uVar81 = *(uint *)(local_1c0 + uVar82);
              uVar82 = *(uint *)(local_3c0 + uVar82);
              fVar148 = auVar1._0_4_;
              if ((float)local_940._0_4_ < 0.0) {
                auVar279 = ZEXT1664(auVar279._0_16_);
                fVar148 = sqrtf((float)local_940._0_4_);
              }
              local_720._0_4_ = fVar148 * 1.9073486e-06;
              auVar99 = vinsertps_avx(ZEXT416(uVar82),ZEXT416(uVar81),0x10);
              bVar89 = true;
              uVar85 = 0;
              do {
                auVar94 = vmovshdup_avx(auVar99);
                fVar152 = 1.0 - auVar94._0_4_;
                auVar6 = vshufps_avx(auVar99,auVar99,0x55);
                fVar148 = auVar6._0_4_;
                auVar134._0_4_ = fVar125 * fVar148;
                fVar149 = auVar6._4_4_;
                auVar134._4_4_ = auVar5._4_4_ * fVar149;
                fVar150 = auVar6._8_4_;
                auVar134._8_4_ = auVar5._8_4_ * fVar150;
                fVar156 = auVar6._12_4_;
                auVar134._12_4_ = auVar5._12_4_ * fVar156;
                auVar165._4_4_ = fVar152;
                auVar165._0_4_ = fVar152;
                auVar165._8_4_ = fVar152;
                auVar165._12_4_ = fVar152;
                auVar6 = vfmadd231ps_fma(auVar134,auVar165,auVar3);
                auVar186._0_4_ = fVar158 * fVar148;
                auVar186._4_4_ = auVar4._4_4_ * fVar149;
                auVar186._8_4_ = auVar4._8_4_ * fVar150;
                auVar186._12_4_ = auVar4._12_4_ * fVar156;
                auVar236 = vfmadd231ps_fma(auVar186,auVar165,auVar5);
                auVar221._0_4_ = fVar148 * auVar236._0_4_;
                auVar221._4_4_ = fVar149 * auVar236._4_4_;
                auVar221._8_4_ = fVar150 * auVar236._8_4_;
                auVar221._12_4_ = fVar156 * auVar236._12_4_;
                auVar160 = vfmadd231ps_fma(auVar221,auVar165,auVar6);
                auVar135._0_4_ = fVar148 * fVar179;
                auVar135._4_4_ = fVar149 * fStack_abc;
                auVar135._8_4_ = fVar150 * fStack_ab8;
                auVar135._12_4_ = fVar156 * fStack_ab4;
                auVar6 = vfmadd231ps_fma(auVar135,auVar165,auVar4);
                auVar207._0_4_ = fVar148 * auVar6._0_4_;
                auVar207._4_4_ = fVar149 * auVar6._4_4_;
                auVar207._8_4_ = fVar150 * auVar6._8_4_;
                auVar207._12_4_ = fVar156 * auVar6._12_4_;
                auVar236 = vfmadd231ps_fma(auVar207,auVar165,auVar236);
                fVar154 = auVar99._0_4_;
                auVar136._4_4_ = fVar154;
                auVar136._0_4_ = fVar154;
                auVar136._8_4_ = fVar154;
                auVar136._12_4_ = fVar154;
                auVar6 = vfmadd213ps_fma(auVar136,local_930,_DAT_01f7aa10);
                auVar100._0_4_ = fVar148 * auVar236._0_4_;
                auVar100._4_4_ = fVar149 * auVar236._4_4_;
                auVar100._8_4_ = fVar150 * auVar236._8_4_;
                auVar100._12_4_ = fVar156 * auVar236._12_4_;
                auVar101 = vfmadd231ps_fma(auVar100,auVar160,auVar165);
                local_700._0_16_ = auVar101;
                auVar6 = vsubps_avx(auVar6,auVar101);
                _local_8e0 = auVar6;
                auVar6 = vdpps_avx(auVar6,auVar6,0x7f);
                fVar148 = auVar6._0_4_;
                if (fVar148 < 0.0) {
                  auVar279 = ZEXT1664(auVar279._0_16_);
                  auVar123._0_4_ = sqrtf(fVar148);
                  auVar123._4_60_ = extraout_var_00;
                  auVar101 = auVar123._0_16_;
                }
                else {
                  auVar101 = vsqrtss_avx(auVar6,auVar6);
                }
                auVar236 = vsubps_avx(auVar236,auVar160);
                auVar232._0_4_ = auVar236._0_4_ * 3.0;
                auVar232._4_4_ = auVar236._4_4_ * 3.0;
                auVar232._8_4_ = auVar236._8_4_ * 3.0;
                auVar232._12_4_ = auVar236._12_4_ * 3.0;
                auVar236 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),ZEXT416((uint)fVar152),
                                           auVar94);
                auVar160 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar94,
                                           ZEXT416((uint)fVar152));
                fVar152 = fVar152 * 6.0;
                fVar149 = auVar236._0_4_ * 6.0;
                fVar150 = auVar160._0_4_ * 6.0;
                fVar156 = auVar94._0_4_ * 6.0;
                auVar187._0_4_ = fVar156 * fVar179;
                auVar187._4_4_ = fVar156 * fStack_abc;
                auVar187._8_4_ = fVar156 * fStack_ab8;
                auVar187._12_4_ = fVar156 * fStack_ab4;
                auVar137._4_4_ = fVar150;
                auVar137._0_4_ = fVar150;
                auVar137._8_4_ = fVar150;
                auVar137._12_4_ = fVar150;
                auVar94 = vfmadd132ps_fma(auVar137,auVar187,auVar4);
                auVar188._4_4_ = fVar149;
                auVar188._0_4_ = fVar149;
                auVar188._8_4_ = fVar149;
                auVar188._12_4_ = fVar149;
                auVar94 = vfmadd132ps_fma(auVar188,auVar94,auVar5);
                auVar236 = vdpps_avx(auVar232,auVar232,0x7f);
                auVar138._4_4_ = fVar152;
                auVar138._0_4_ = fVar152;
                auVar138._8_4_ = fVar152;
                auVar138._12_4_ = fVar152;
                auVar233 = vfmadd132ps_fma(auVar138,auVar94,auVar3);
                auVar94 = vblendps_avx(auVar236,_DAT_01f7aa10,0xe);
                auVar160 = vrsqrtss_avx(auVar94,auVar94);
                fVar156 = auVar236._0_4_;
                fVar149 = auVar160._0_4_;
                auVar160 = vdpps_avx(auVar232,auVar233,0x7f);
                fVar149 = fVar149 * 1.5 + fVar156 * -0.5 * fVar149 * fVar149 * fVar149;
                auVar139._0_4_ = auVar233._0_4_ * fVar156;
                auVar139._4_4_ = auVar233._4_4_ * fVar156;
                auVar139._8_4_ = auVar233._8_4_ * fVar156;
                auVar139._12_4_ = auVar233._12_4_ * fVar156;
                fVar150 = auVar160._0_4_;
                auVar222._0_4_ = auVar232._0_4_ * fVar150;
                auVar222._4_4_ = auVar232._4_4_ * fVar150;
                auVar222._8_4_ = auVar232._8_4_ * fVar150;
                auVar222._12_4_ = auVar232._12_4_ * fVar150;
                auVar160 = vsubps_avx(auVar139,auVar222);
                auVar94 = vrcpss_avx(auVar94,auVar94);
                auVar233 = vfnmadd213ss_fma(auVar94,auVar236,ZEXT416(0x40000000));
                fVar150 = auVar94._0_4_ * auVar233._0_4_;
                auVar94 = vmaxss_avx(ZEXT416((uint)fVar126),
                                     ZEXT416((uint)(fVar154 * (float)local_720._0_4_)));
                auVar146 = ZEXT1664(auVar94);
                uVar84 = CONCAT44(auVar232._4_4_,auVar232._0_4_);
                auVar245._0_8_ = uVar84 ^ 0x8000000080000000;
                auVar245._8_4_ = -auVar232._8_4_;
                auVar245._12_4_ = -auVar232._12_4_;
                auVar189._0_4_ = fVar149 * auVar160._0_4_ * fVar150;
                auVar189._4_4_ = fVar149 * auVar160._4_4_ * fVar150;
                auVar189._8_4_ = fVar149 * auVar160._8_4_ * fVar150;
                auVar189._12_4_ = fVar149 * auVar160._12_4_ * fVar150;
                local_960._0_4_ = auVar232._0_4_ * fVar149;
                local_960._4_4_ = auVar232._4_4_ * fVar149;
                local_960._8_4_ = auVar232._8_4_ * fVar149;
                local_960._12_4_ = auVar232._12_4_ * fVar149;
                if (fVar156 < -fVar156) {
                  local_980._0_16_ = auVar189;
                  auVar279 = ZEXT1664(auVar279._0_16_);
                  fVar149 = sqrtf(fVar156);
                  auVar101 = ZEXT416(auVar101._0_4_);
                  auVar146 = ZEXT464(auVar94._0_4_);
                  auVar189 = local_980._0_16_;
                }
                else {
                  auVar236 = vsqrtss_avx(auVar236,auVar236);
                  fVar149 = auVar236._0_4_;
                }
                auVar236 = vdpps_avx(_local_8e0,local_960._0_16_,0x7f);
                auVar166 = vfmadd213ss_fma(ZEXT416((uint)fVar126),auVar101,auVar146._0_16_);
                auVar160 = vdpps_avx(auVar245,local_960._0_16_,0x7f);
                auVar233 = vdpps_avx(_local_8e0,auVar189,0x7f);
                auVar268 = vdpps_avx(local_930,local_960._0_16_,0x7f);
                auVar127 = vfmadd213ss_fma(ZEXT416((uint)(auVar101._0_4_ + 1.0)),
                                           ZEXT416((uint)(fVar126 / fVar149)),auVar166);
                auVar102._0_4_ = auVar236._0_4_ * auVar236._0_4_;
                auVar102._4_4_ = auVar236._4_4_ * auVar236._4_4_;
                auVar102._8_4_ = auVar236._8_4_ * auVar236._8_4_;
                auVar102._12_4_ = auVar236._12_4_ * auVar236._12_4_;
                auVar101 = vdpps_avx(_local_8e0,auVar245,0x7f);
                auVar96 = vsubps_avx(auVar6,auVar102);
                auVar166 = vrsqrtss_avx(auVar96,auVar96);
                fVar150 = auVar96._0_4_;
                fVar149 = auVar166._0_4_;
                fVar149 = fVar149 * 1.5 + fVar150 * -0.5 * fVar149 * fVar149 * fVar149;
                auVar166 = vdpps_avx(_local_8e0,local_930,0x7f);
                auVar233 = ZEXT416((uint)(auVar160._0_4_ + auVar233._0_4_));
                local_960._0_16_ = vfnmadd231ss_fma(auVar101,auVar236,auVar233);
                auVar160 = vfnmadd231ss_fma(auVar166,auVar236,auVar268);
                if (fVar150 < 0.0) {
                  local_980._0_16_ = auVar236;
                  local_740._0_16_ = auVar268;
                  local_760._0_4_ = fVar149;
                  local_780._0_16_ = auVar160;
                  auVar279 = ZEXT1664(auVar279._0_16_);
                  fVar150 = sqrtf(fVar150);
                  auVar146 = ZEXT464(auVar94._0_4_);
                  fVar149 = (float)local_760._0_4_;
                  auVar160 = local_780._0_16_;
                  auVar236 = local_980._0_16_;
                  auVar268 = local_740._0_16_;
                }
                else {
                  auVar94 = vsqrtss_avx(auVar96,auVar96);
                  fVar150 = auVar94._0_4_;
                }
                auVar261 = ZEXT1664(auVar6);
                auVar249 = ZEXT1664(auVar232);
                auVar94 = vpermilps_avx(local_700._0_16_,0xff);
                fVar150 = fVar150 - auVar94._0_4_;
                auVar101 = vshufps_avx(auVar232,auVar232,0xff);
                auVar94 = vfmsub213ss_fma(local_960._0_16_,ZEXT416((uint)fVar149),auVar101);
                auVar190._0_8_ = auVar268._0_8_ ^ 0x8000000080000000;
                auVar190._8_4_ = auVar268._8_4_ ^ 0x80000000;
                auVar190._12_4_ = auVar268._12_4_ ^ 0x80000000;
                auVar208._0_8_ = auVar94._0_8_ ^ 0x8000000080000000;
                auVar208._8_4_ = auVar94._8_4_ ^ 0x80000000;
                auVar208._12_4_ = auVar94._12_4_ ^ 0x80000000;
                auVar166 = ZEXT416((uint)(auVar160._0_4_ * fVar149));
                auVar160 = vfmsub231ss_fma(ZEXT416((uint)(auVar268._0_4_ * auVar94._0_4_)),auVar233,
                                           auVar166);
                auVar94 = vinsertps_avx(auVar208,auVar166,0x1c);
                uVar92 = auVar160._0_4_;
                auVar209._4_4_ = uVar92;
                auVar209._0_4_ = uVar92;
                auVar209._8_4_ = uVar92;
                auVar209._12_4_ = uVar92;
                auVar94 = vdivps_avx(auVar94,auVar209);
                auVar160 = vinsertps_avx(auVar233,auVar190,0x10);
                auVar160 = vdivps_avx(auVar160,auVar209);
                fVar149 = auVar236._0_4_;
                auVar167._0_4_ = fVar149 * auVar94._0_4_ + fVar150 * auVar160._0_4_;
                auVar167._4_4_ = fVar149 * auVar94._4_4_ + fVar150 * auVar160._4_4_;
                auVar167._8_4_ = fVar149 * auVar94._8_4_ + fVar150 * auVar160._8_4_;
                auVar167._12_4_ = fVar149 * auVar94._12_4_ + fVar150 * auVar160._12_4_;
                auVar99 = vsubps_avx(auVar99,auVar167);
                auVar94 = vandps_avx(auVar236,local_900);
                if (auVar94._0_4_ < auVar127._0_4_) {
                  auVar236 = vfmadd231ss_fma(ZEXT416((uint)(auVar146._0_4_ + auVar127._0_4_)),
                                             local_7a0,ZEXT416(0x36000000));
                  auVar94 = vandps_avx(ZEXT416((uint)fVar150),local_900);
                  if (auVar94._0_4_ < auVar236._0_4_) {
                    fVar149 = auVar99._0_4_ + (float)local_8a0._0_4_;
                    if (fVar149 < fVar124) {
                      bVar90 = 0;
                    }
                    else {
                      fVar150 = *(float *)(ray + k * 4 + 0x80);
                      if (fVar150 < fVar149) {
                        bVar90 = 0;
                      }
                      else {
                        auVar94 = vmovshdup_avx(auVar99);
                        bVar90 = 0;
                        if ((0.0 <= auVar94._0_4_) && (auVar94._0_4_ <= 1.0)) {
                          auVar94 = vrsqrtss_avx(auVar6,auVar6);
                          fVar156 = auVar94._0_4_;
                          pGVar8 = (context->scene->geometries).items[uVar83].ptr;
                          if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                            bVar90 = 0;
                          }
                          else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                  (bVar90 = 1, pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0))
                          {
                            fVar148 = fVar156 * 1.5 + fVar148 * -0.5 * fVar156 * fVar156 * fVar156;
                            auVar168._0_4_ = fVar148 * (float)local_8e0._0_4_;
                            auVar168._4_4_ = fVar148 * (float)local_8e0._4_4_;
                            auVar168._8_4_ = fVar148 * fStack_8d8;
                            auVar168._12_4_ = fVar148 * fStack_8d4;
                            auVar101 = vfmadd213ps_fma(auVar101,auVar168,auVar232);
                            auVar94 = vshufps_avx(auVar168,auVar168,0xc9);
                            auVar236 = vshufps_avx(auVar232,auVar232,0xc9);
                            auVar169._0_4_ = auVar168._0_4_ * auVar236._0_4_;
                            auVar169._4_4_ = auVar168._4_4_ * auVar236._4_4_;
                            auVar169._8_4_ = auVar168._8_4_ * auVar236._8_4_;
                            auVar169._12_4_ = auVar168._12_4_ * auVar236._12_4_;
                            auVar160 = vfmsub231ps_fma(auVar169,auVar232,auVar94);
                            auVar94 = vshufps_avx(auVar160,auVar160,0xc9);
                            auVar236 = vshufps_avx(auVar101,auVar101,0xc9);
                            auVar160 = vshufps_avx(auVar160,auVar160,0xd2);
                            auVar103._0_4_ = auVar101._0_4_ * auVar160._0_4_;
                            auVar103._4_4_ = auVar101._4_4_ * auVar160._4_4_;
                            auVar103._8_4_ = auVar101._8_4_ * auVar160._8_4_;
                            auVar103._12_4_ = auVar101._12_4_ * auVar160._12_4_;
                            auVar94 = vfmsub231ps_fma(auVar103,auVar94,auVar236);
                            local_690 = vshufps_avx(auVar99,auVar99,0x55);
                            local_6c0 = (RTCHitN  [16])vshufps_avx(auVar94,auVar94,0x55);
                            auStack_6b0 = vshufps_avx(auVar94,auVar94,0xaa);
                            local_6a0 = auVar94._0_4_;
                            local_680 = ZEXT416(0) << 0x20;
                            local_670 = CONCAT44(uStack_6dc,local_6e0);
                            uStack_668 = CONCAT44(uStack_6d4,uStack_6d8);
                            local_660._4_4_ = uStack_6cc;
                            local_660._0_4_ = local_6d0;
                            local_660._8_4_ = uStack_6c8;
                            local_660._12_4_ = uStack_6c4;
                            vpcmpeqd_avx2(ZEXT1632(local_660),ZEXT1632(local_660));
                            uStack_64c = context->user->instID[0];
                            local_650 = uStack_64c;
                            uStack_648 = uStack_64c;
                            uStack_644 = uStack_64c;
                            uStack_640 = context->user->instPrimID[0];
                            uStack_63c = uStack_640;
                            uStack_638 = uStack_640;
                            uStack_634 = uStack_640;
                            *(float *)(ray + k * 4 + 0x80) = fVar149;
                            local_890 = *(undefined1 (*) [16])
                                         (mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
                            local_9d0.valid = (int *)local_890;
                            local_9d0.geometryUserPtr = pGVar8->userPtr;
                            local_9d0.context = context->user;
                            local_9d0.hit = local_6c0;
                            local_9d0.N = 4;
                            local_9d0.ray = (RTCRayN *)ray;
                            uStack_69c = local_6a0;
                            uStack_698 = local_6a0;
                            uStack_694 = local_6a0;
                            if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                              auVar249 = ZEXT1664(auVar232);
                              auVar261 = ZEXT1664(auVar6);
                              auVar279 = ZEXT1664(auVar279._0_16_);
                              (*pGVar8->occlusionFilterN)(&local_9d0);
                            }
                            if (local_890 == (undefined1  [16])0x0) {
                              auVar99 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                              auVar99 = auVar99 ^ _DAT_01f7ae20;
                            }
                            else {
                              p_Var9 = context->args->filter;
                              if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                                auVar249 = ZEXT1664(auVar249._0_16_);
                                auVar261 = ZEXT1664(auVar261._0_16_);
                                auVar279 = ZEXT1664(auVar279._0_16_);
                                (*p_Var9)(&local_9d0);
                              }
                              auVar6 = vpcmpeqd_avx(local_890,_DAT_01f7aa10);
                              auVar99 = auVar6 ^ _DAT_01f7ae20;
                              auVar170._8_4_ = 0xff800000;
                              auVar170._0_8_ = 0xff800000ff800000;
                              auVar170._12_4_ = 0xff800000;
                              auVar6 = vblendvps_avx(auVar170,*(undefined1 (*) [16])
                                                               (local_9d0.ray + 0x80),auVar6);
                              *(undefined1 (*) [16])(local_9d0.ray + 0x80) = auVar6;
                            }
                            auVar140._8_8_ = 0x100000001;
                            auVar140._0_8_ = 0x100000001;
                            bVar90 = (auVar140 & auVar99) != (undefined1  [16])0x0;
                            if (!(bool)bVar90) {
                              *(float *)(ray + k * 4 + 0x80) = fVar150;
                            }
                          }
                        }
                      }
                    }
                    goto LAB_01766832;
                  }
                }
                bVar89 = uVar85 < 4;
                uVar85 = uVar85 + 1;
              } while (uVar85 != 5);
              bVar89 = false;
              bVar90 = 5;
LAB_01766832:
              bVar86 = (bool)(bVar86 | bVar89 & bVar90);
              uVar92 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar117._4_4_ = uVar92;
              auVar117._0_4_ = uVar92;
              auVar117._8_4_ = uVar92;
              auVar117._12_4_ = uVar92;
              auVar117._16_4_ = uVar92;
              auVar117._20_4_ = uVar92;
              auVar117._24_4_ = uVar92;
              auVar117._28_4_ = uVar92;
              auVar224 = vcmpps_avx(_local_820,auVar117,2);
              auVar104 = vandps_avx(auVar224,local_8c0);
              auVar224 = local_8c0 & auVar224;
              local_8c0 = auVar104;
            } while ((((((((auVar224 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar224 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar224 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar224 >> 0x7f,0) != '\0') ||
                       (auVar224 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar224 >> 0xbf,0) != '\0') ||
                     (auVar224 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar224[0x1f] < '\0');
          }
          auVar178._0_4_ = (float)local_920._0_4_ + local_420._0_4_;
          auVar178._4_4_ = (float)local_920._4_4_ + local_420._4_4_;
          auVar178._8_4_ = fStack_918 + local_420._8_4_;
          auVar178._12_4_ = fStack_914 + local_420._12_4_;
          auVar178._16_4_ = fStack_910 + local_420._16_4_;
          auVar178._20_4_ = fStack_90c + local_420._20_4_;
          auVar178._24_4_ = fStack_908 + local_420._24_4_;
          auVar178._28_4_ = fStack_904 + local_420._28_4_;
          auVar224 = vcmpps_avx(auVar178,auVar117,2);
          auVar104 = vandps_avx(local_560,local_540);
          auVar104 = vandps_avx(auVar224,auVar104);
          auVar197._0_4_ = local_3e0._0_4_ + (float)local_920._0_4_;
          auVar197._4_4_ = local_3e0._4_4_ + (float)local_920._4_4_;
          auVar197._8_4_ = local_3e0._8_4_ + fStack_918;
          auVar197._12_4_ = local_3e0._12_4_ + fStack_914;
          auVar197._16_4_ = local_3e0._16_4_ + fStack_910;
          auVar197._20_4_ = local_3e0._20_4_ + fStack_90c;
          auVar197._24_4_ = local_3e0._24_4_ + fStack_908;
          auVar197._28_4_ = local_3e0._28_4_ + fStack_904;
          auVar107 = vcmpps_avx(auVar197,auVar117,2);
          auVar224 = vandps_avx(_local_860,local_840);
          auVar224 = vandps_avx(auVar107,auVar224);
          auVar224 = vorps_avx(auVar104,auVar224);
          if ((((((((auVar224 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar224 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar224 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar224 >> 0x7f,0) != '\0') ||
                (auVar224 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar224 >> 0xbf,0) != '\0') ||
              (auVar224 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar224[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar88 * 0x60) = auVar224;
            auVar104 = vblendvps_avx(local_3e0,local_420,auVar104);
            *(undefined1 (*) [32])(auStack_160 + uVar88 * 0x60) = auVar104;
            uVar93 = vmovlps_avx(local_4f0);
            (&uStack_140)[uVar88 * 0xc] = uVar93;
            aiStack_138[uVar88 * 0x18] = local_bac + 1;
            iVar87 = iVar87 + 1;
          }
        }
      }
    }
    auVar224 = local_4a0;
    if (iVar87 == 0) break;
    uVar92 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar114._4_4_ = uVar92;
    auVar114._0_4_ = uVar92;
    auVar114._8_4_ = uVar92;
    auVar114._12_4_ = uVar92;
    auVar114._16_4_ = uVar92;
    auVar114._20_4_ = uVar92;
    auVar114._24_4_ = uVar92;
    auVar114._28_4_ = uVar92;
    uVar81 = -iVar87;
    pauVar80 = (undefined1 (*) [32])(auStack_180 + (ulong)(iVar87 - 1) * 0x60);
    fVar126 = (float)local_920._0_4_;
    fVar148 = (float)local_920._4_4_;
    fVar149 = fStack_918;
    fVar150 = fStack_914;
    fVar156 = fStack_910;
    fVar152 = fStack_90c;
    fVar154 = fStack_908;
    fVar151 = fStack_904;
    while( true ) {
      auVar104 = pauVar80[1];
      auVar142._0_4_ = fVar126 + auVar104._0_4_;
      auVar142._4_4_ = fVar148 + auVar104._4_4_;
      auVar142._8_4_ = fVar149 + auVar104._8_4_;
      auVar142._12_4_ = fVar150 + auVar104._12_4_;
      auVar142._16_4_ = fVar156 + auVar104._16_4_;
      auVar142._20_4_ = fVar152 + auVar104._20_4_;
      auVar142._24_4_ = fVar154 + auVar104._24_4_;
      auVar142._28_4_ = fVar151 + auVar104._28_4_;
      auVar107 = vcmpps_avx(auVar142,auVar114,2);
      _local_6c0 = vandps_avx(auVar107,*pauVar80);
      auVar107 = *pauVar80 & auVar107;
      if ((((((((auVar107 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar107 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar107 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar107 >> 0x7f,0) != '\0') ||
            (auVar107 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar107 >> 0xbf,0) != '\0') ||
          (auVar107 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar107[0x1f] < '\0') break;
      pauVar80 = pauVar80 + -3;
      uVar81 = uVar81 + 1;
      fVar126 = (float)local_920._0_4_;
      fVar148 = (float)local_920._4_4_;
      fVar149 = fStack_918;
      fVar150 = fStack_914;
      fVar156 = fStack_910;
      fVar152 = fStack_90c;
      fVar154 = fStack_908;
      fVar151 = fStack_904;
      if (uVar81 == 0) goto LAB_01766d37;
    }
    auVar115._8_4_ = 0x7f800000;
    auVar115._0_8_ = 0x7f8000007f800000;
    auVar115._12_4_ = 0x7f800000;
    auVar115._16_4_ = 0x7f800000;
    auVar115._20_4_ = 0x7f800000;
    auVar115._24_4_ = 0x7f800000;
    auVar115._28_4_ = 0x7f800000;
    auVar104 = vblendvps_avx(auVar115,auVar104,_local_6c0);
    auVar107 = vshufps_avx(auVar104,auVar104,0xb1);
    auVar107 = vminps_avx(auVar104,auVar107);
    auVar253 = vshufpd_avx(auVar107,auVar107,5);
    auVar107 = vminps_avx(auVar107,auVar253);
    auVar253 = vpermpd_avx2(auVar107,0x4e);
    auVar107 = vminps_avx(auVar107,auVar253);
    auVar107 = vcmpps_avx(auVar104,auVar107,0);
    auVar253 = _local_6c0 & auVar107;
    auVar104 = _local_6c0;
    if ((((((((auVar253 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar253 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar253 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar253 >> 0x7f,0) != '\0') ||
          (auVar253 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar253 >> 0xbf,0) != '\0') ||
        (auVar253 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar253[0x1f] < '\0') {
      auVar104 = vandps_avx(auVar107,_local_6c0);
    }
    uVar85 = *(ulong *)pauVar80[2];
    auVar95._8_8_ = 0;
    auVar95._0_8_ = uVar85;
    uVar82 = vmovmskps_avx(auVar104);
    iVar87 = 0;
    for (; (uVar82 & 1) == 0; uVar82 = uVar82 >> 1 | 0x80000000) {
      iVar87 = iVar87 + 1;
    }
    *(undefined4 *)(local_6c0 + (uint)(iVar87 << 2)) = 0;
    uVar82 = ~uVar81;
    if ((((((((_local_6c0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (_local_6c0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (_local_6c0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(_local_6c0 >> 0x7f,0) != '\0') ||
          (_local_6c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(_local_6c0 >> 0xbf,0) != '\0') ||
        (_local_6c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_6c0[0x1f] < '\0') {
      uVar82 = -uVar81;
    }
    uVar88 = (ulong)uVar82;
    local_bac = *(int *)(pauVar80[2] + 8);
    *pauVar80 = _local_6c0;
    uVar92 = (undefined4)uVar85;
    auVar143._4_4_ = uVar92;
    auVar143._0_4_ = uVar92;
    auVar143._8_4_ = uVar92;
    auVar143._12_4_ = uVar92;
    auVar143._16_4_ = uVar92;
    auVar143._20_4_ = uVar92;
    auVar143._24_4_ = uVar92;
    auVar143._28_4_ = uVar92;
    auVar99 = vmovshdup_avx(auVar95);
    auVar99 = vsubps_avx(auVar99,auVar95);
    auVar116._0_4_ = auVar99._0_4_;
    auVar116._4_4_ = auVar116._0_4_;
    auVar116._8_4_ = auVar116._0_4_;
    auVar116._12_4_ = auVar116._0_4_;
    auVar116._16_4_ = auVar116._0_4_;
    auVar116._20_4_ = auVar116._0_4_;
    auVar116._24_4_ = auVar116._0_4_;
    auVar116._28_4_ = auVar116._0_4_;
    auVar99 = vfmadd132ps_fma(auVar116,auVar143,_DAT_01faff20);
    local_420 = ZEXT1632(auVar99);
    local_4f0._8_8_ = 0;
    local_4f0._0_8_ = *(ulong *)(local_420 + (uint)(iVar87 << 2));
  } while( true );
LAB_01766d37:
  if (bVar86 != false) {
    return bVar86;
  }
  uVar92 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar121._4_4_ = uVar92;
  auVar121._0_4_ = uVar92;
  auVar121._8_4_ = uVar92;
  auVar121._12_4_ = uVar92;
  auVar121._16_4_ = uVar92;
  auVar121._20_4_ = uVar92;
  auVar121._24_4_ = uVar92;
  auVar121._28_4_ = uVar92;
  auVar104 = vcmpps_avx(local_360,auVar121,2);
  uVar83 = vmovmskps_avx(auVar104);
  uVar83 = (uint)local_868 & uVar83;
  if (uVar83 == 0) {
    return false;
  }
  goto LAB_017646db;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }